

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [32];
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [28];
  uint uVar97;
  int iVar98;
  uint uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  long lVar103;
  undefined4 uVar104;
  undefined8 uVar105;
  float fVar126;
  vint4 bi_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar125;
  float fVar127;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar112 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined8 uVar131;
  vint4 bi_1;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar151;
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined4 uVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  float fVar223;
  float fVar227;
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined4 uVar229;
  float fVar230;
  undefined4 uVar231;
  float fVar232;
  undefined4 uVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar228 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  RayQueryContext *local_798;
  RayHitK<8> *local_790;
  undefined1 (*local_788) [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 uStack_764;
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [2] [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  int local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar167 [32];
  
  PVar10 = prim[1];
  uVar102 = (ulong)(byte)PVar10;
  fVar152 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  auVar106._0_4_ = fVar152 * auVar15._0_4_;
  auVar106._4_4_ = fVar152 * auVar15._4_4_;
  auVar106._8_4_ = fVar152 * auVar15._8_4_;
  auVar106._12_4_ = fVar152 * auVar15._12_4_;
  auVar185._0_4_ = fVar152 * auVar16._0_4_;
  auVar185._4_4_ = fVar152 * auVar16._4_4_;
  auVar185._8_4_ = fVar152 * auVar16._8_4_;
  auVar185._12_4_ = fVar152 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 6 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar102 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar100 = (ulong)(uint)((int)(uVar102 * 9) * 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 + uVar102 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar100 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar237._4_4_ = auVar185._0_4_;
  auVar237._0_4_ = auVar185._0_4_;
  auVar237._8_4_ = auVar185._0_4_;
  auVar237._12_4_ = auVar185._0_4_;
  auVar133 = vshufps_avx(auVar185,auVar185,0x55);
  auVar107 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar152 = auVar107._0_4_;
  auVar219._0_4_ = fVar152 * auVar111._0_4_;
  fVar151 = auVar107._4_4_;
  auVar219._4_4_ = fVar151 * auVar111._4_4_;
  fVar125 = auVar107._8_4_;
  auVar219._8_4_ = fVar125 * auVar111._8_4_;
  fVar126 = auVar107._12_4_;
  auVar219._12_4_ = fVar126 * auVar111._12_4_;
  auVar212._0_4_ = auVar20._0_4_ * fVar152;
  auVar212._4_4_ = auVar20._4_4_ * fVar151;
  auVar212._8_4_ = auVar20._8_4_ * fVar125;
  auVar212._12_4_ = auVar20._12_4_ * fVar126;
  auVar202._0_4_ = auVar153._0_4_ * fVar152;
  auVar202._4_4_ = auVar153._4_4_ * fVar151;
  auVar202._8_4_ = auVar153._8_4_ * fVar125;
  auVar202._12_4_ = auVar153._12_4_ * fVar126;
  auVar107 = vfmadd231ps_fma(auVar219,auVar133,auVar16);
  auVar134 = vfmadd231ps_fma(auVar212,auVar133,auVar19);
  auVar133 = vfmadd231ps_fma(auVar202,auVar108,auVar133);
  auVar168 = vfmadd231ps_fma(auVar107,auVar237,auVar15);
  auVar134 = vfmadd231ps_fma(auVar134,auVar237,auVar18);
  auVar177 = vfmadd231ps_fma(auVar133,auVar109,auVar237);
  auVar238._4_4_ = auVar106._0_4_;
  auVar238._0_4_ = auVar106._0_4_;
  auVar238._8_4_ = auVar106._0_4_;
  auVar238._12_4_ = auVar106._0_4_;
  auVar133 = vshufps_avx(auVar106,auVar106,0x55);
  auVar107 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar152 = auVar107._0_4_;
  auVar186._0_4_ = fVar152 * auVar111._0_4_;
  fVar151 = auVar107._4_4_;
  auVar186._4_4_ = fVar151 * auVar111._4_4_;
  fVar125 = auVar107._8_4_;
  auVar186._8_4_ = fVar125 * auVar111._8_4_;
  fVar126 = auVar107._12_4_;
  auVar186._12_4_ = fVar126 * auVar111._12_4_;
  auVar132._0_4_ = auVar20._0_4_ * fVar152;
  auVar132._4_4_ = auVar20._4_4_ * fVar151;
  auVar132._8_4_ = auVar20._8_4_ * fVar125;
  auVar132._12_4_ = auVar20._12_4_ * fVar126;
  auVar107._0_4_ = auVar153._0_4_ * fVar152;
  auVar107._4_4_ = auVar153._4_4_ * fVar151;
  auVar107._8_4_ = auVar153._8_4_ * fVar125;
  auVar107._12_4_ = auVar153._12_4_ * fVar126;
  auVar16 = vfmadd231ps_fma(auVar186,auVar133,auVar16);
  auVar111 = vfmadd231ps_fma(auVar132,auVar133,auVar19);
  auVar19 = vfmadd231ps_fma(auVar107,auVar133,auVar108);
  auVar20 = vfmadd231ps_fma(auVar16,auVar238,auVar15);
  auVar108 = vfmadd231ps_fma(auVar111,auVar238,auVar18);
  auVar153 = vfmadd231ps_fma(auVar19,auVar238,auVar109);
  local_450._8_4_ = 0x7fffffff;
  local_450._0_8_ = 0x7fffffff7fffffff;
  local_450._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar168,local_450);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar176,1);
  auVar16 = vblendvps_avx(auVar168,auVar176,auVar15);
  auVar15 = vandps_avx(auVar134,local_450);
  auVar15 = vcmpps_avx(auVar15,auVar176,1);
  auVar111 = vblendvps_avx(auVar134,auVar176,auVar15);
  auVar15 = vandps_avx(auVar177,local_450);
  auVar15 = vcmpps_avx(auVar15,auVar176,1);
  auVar15 = vblendvps_avx(auVar177,auVar176,auVar15);
  auVar18 = vrcpps_avx(auVar16);
  auVar199._8_4_ = 0x3f800000;
  auVar199._0_8_ = 0x3f8000003f800000;
  auVar199._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar199);
  auVar18 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar111);
  auVar111 = vfnmadd213ps_fma(auVar111,auVar16,auVar199);
  auVar19 = vfmadd132ps_fma(auVar111,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar199);
  auVar109 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar102 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar20);
  auVar177._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar177._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar177._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar177._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar102 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar20);
  auVar187._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar187._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar187._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar187._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar10;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar111);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar102 * -2 + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar108);
  auVar203._0_4_ = auVar15._0_4_ * auVar19._0_4_;
  auVar203._4_4_ = auVar15._4_4_ * auVar19._4_4_;
  auVar203._8_4_ = auVar15._8_4_ * auVar19._8_4_;
  auVar203._12_4_ = auVar15._12_4_ * auVar19._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar16);
  auVar15 = vsubps_avx(auVar15,auVar108);
  auVar133._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar133._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar133._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar133._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar100 + uVar102 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar153);
  auVar168._0_4_ = auVar109._0_4_ * auVar15._0_4_;
  auVar168._4_4_ = auVar109._4_4_ * auVar15._4_4_;
  auVar168._8_4_ = auVar109._8_4_ * auVar15._8_4_;
  auVar168._12_4_ = auVar109._12_4_ * auVar15._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar102 * 0x17 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar153);
  auVar108._0_4_ = auVar109._0_4_ * auVar15._0_4_;
  auVar108._4_4_ = auVar109._4_4_ * auVar15._4_4_;
  auVar108._8_4_ = auVar109._8_4_ * auVar15._8_4_;
  auVar108._12_4_ = auVar109._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar177,auVar187);
  auVar16 = vpminsd_avx(auVar203,auVar133);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar168,auVar108);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar207._4_4_ = uVar104;
  auVar207._0_4_ = uVar104;
  auVar207._8_4_ = uVar104;
  auVar207._12_4_ = uVar104;
  auVar16 = vmaxps_avx(auVar16,auVar207);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_460._0_4_ = auVar15._0_4_ * 0.99999964;
  local_460._4_4_ = auVar15._4_4_ * 0.99999964;
  local_460._8_4_ = auVar15._8_4_ * 0.99999964;
  local_460._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar177,auVar187);
  auVar16 = vpmaxsd_avx(auVar203,auVar133);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar168,auVar108);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar104;
  auVar153._0_4_ = uVar104;
  auVar153._8_4_ = uVar104;
  auVar153._12_4_ = uVar104;
  auVar16 = vminps_avx(auVar16,auVar153);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar109._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar109._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar109._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar109._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar134[4] = PVar10;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar10;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar10;
  auVar134._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar134,_DAT_01f7fcf0);
  auVar15 = vcmpps_avx(local_460,auVar109,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar97 = vmovmskps_avx(auVar15);
  if (uVar97 != 0) {
    uVar97 = uVar97 & 0xff;
    local_680[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_680[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_788 = (undefined1 (*) [32])&local_1e0;
    iVar98 = 1 << ((uint)k & 0x1f);
    auVar114._4_4_ = iVar98;
    auVar114._0_4_ = iVar98;
    auVar114._8_4_ = iVar98;
    auVar114._12_4_ = iVar98;
    auVar114._16_4_ = iVar98;
    auVar114._20_4_ = iVar98;
    auVar114._24_4_ = iVar98;
    auVar114._28_4_ = iVar98;
    auVar122 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar114 = vpand_avx2(auVar114,auVar122);
    local_300 = vpcmpeqd_avx2(auVar114,auVar122);
    do {
      auVar114 = local_5e0;
      lVar24 = 0;
      uVar102 = (ulong)uVar97;
      for (uVar100 = uVar102; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar97 = *(uint *)(prim + 2);
      uVar11 = *(uint *)(prim + lVar24 * 4 + 6);
      pGVar12 = (context->scene->geometries).items[uVar97].ptr;
      uVar100 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                                pGVar12[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar11);
      p_Var13 = pGVar12[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar12[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar24 + (long)p_Var13 * uVar100);
      uVar84 = *(undefined8 *)*pauVar1;
      uVar85 = *(undefined8 *)(*pauVar1 + 8);
      auVar153 = *pauVar1;
      auVar20 = *pauVar1;
      auVar111 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar24 + (uVar100 + 1) * (long)p_Var13);
      uVar86 = *(undefined8 *)*pauVar2;
      uVar87 = *(undefined8 *)(*pauVar2 + 8);
      auVar108 = *pauVar2;
      auVar19 = *pauVar2;
      auVar16 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar100 + 2) * (long)p_Var13);
      uVar88 = *(undefined8 *)*pauVar3;
      uVar89 = *(undefined8 *)(*pauVar3 + 8);
      auVar109 = *pauVar3;
      auVar18 = *pauVar3;
      auVar15 = *pauVar3;
      uVar102 = uVar102 - 1 & uVar102;
      pauVar4 = (undefined1 (*) [12])(lVar24 + (uVar100 + 3) * (long)p_Var13);
      uVar90 = *(undefined8 *)*pauVar4;
      uVar91 = *(undefined8 *)(*pauVar4 + 8);
      local_8e0 = (float)uVar90;
      fStack_8dc = (float)((ulong)uVar90 >> 0x20);
      fStack_8d8 = (float)uVar91;
      fStack_8d4 = (float)((ulong)uVar91 >> 0x20);
      if (uVar102 != 0) {
        uVar101 = uVar102 - 1 & uVar102;
        for (uVar100 = uVar102; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        }
        if (uVar101 != 0) {
          for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar98 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar133 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar168 = vinsertps_avx(auVar133,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar107 = vsubps_avx(*pauVar1,auVar168);
      uVar104 = auVar107._0_4_;
      auVar178._4_4_ = uVar104;
      auVar178._0_4_ = uVar104;
      auVar178._8_4_ = uVar104;
      auVar178._12_4_ = uVar104;
      auVar133 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      aVar7 = pre->ray_space[k].vx.field_0;
      aVar8 = pre->ray_space[k].vy.field_0;
      fVar152 = pre->ray_space[k].vz.field_0.m128[0];
      fVar151 = pre->ray_space[k].vz.field_0.m128[1];
      fVar125 = pre->ray_space[k].vz.field_0.m128[2];
      fVar126 = pre->ray_space[k].vz.field_0.m128[3];
      auVar194._0_4_ = fVar152 * auVar107._0_4_;
      auVar194._4_4_ = fVar151 * auVar107._4_4_;
      auVar194._8_4_ = fVar125 * auVar107._8_4_;
      auVar194._12_4_ = fVar126 * auVar107._12_4_;
      auVar133 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar8,auVar133);
      auVar106 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar7,auVar178);
      auVar133 = vblendps_avx(auVar106,*pauVar1,8);
      auVar134 = vsubps_avx(*pauVar2,auVar168);
      uVar104 = auVar134._0_4_;
      auVar195._4_4_ = uVar104;
      auVar195._0_4_ = uVar104;
      auVar195._8_4_ = uVar104;
      auVar195._12_4_ = uVar104;
      auVar107 = vshufps_avx(auVar134,auVar134,0x55);
      auVar134 = vshufps_avx(auVar134,auVar134,0xaa);
      auVar213._0_4_ = fVar152 * auVar134._0_4_;
      auVar213._4_4_ = fVar151 * auVar134._4_4_;
      auVar213._8_4_ = fVar125 * auVar134._8_4_;
      auVar213._12_4_ = fVar126 * auVar134._12_4_;
      auVar107 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar8,auVar107);
      auVar132 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar7,auVar195);
      auVar107 = vblendps_avx(auVar132,*pauVar2,8);
      auVar177 = vsubps_avx(*pauVar3,auVar168);
      uVar104 = auVar177._0_4_;
      auVar200._4_4_ = uVar104;
      auVar200._0_4_ = uVar104;
      auVar200._8_4_ = uVar104;
      auVar200._12_4_ = uVar104;
      auVar134 = vshufps_avx(auVar177,auVar177,0x55);
      auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
      auVar220._0_4_ = fVar152 * auVar177._0_4_;
      auVar220._4_4_ = fVar151 * auVar177._4_4_;
      auVar220._8_4_ = fVar125 * auVar177._8_4_;
      auVar220._12_4_ = fVar126 * auVar177._12_4_;
      auVar134 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar8,auVar134);
      auVar176 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar7,auVar200);
      auVar134 = vblendps_avx(auVar176,*pauVar3,8);
      auVar92._12_4_ = fStack_8d4;
      auVar92._0_12_ = *pauVar4;
      auVar177 = vsubps_avx(auVar92,auVar168);
      uVar104 = auVar177._0_4_;
      auVar201._4_4_ = uVar104;
      auVar201._0_4_ = uVar104;
      auVar201._8_4_ = uVar104;
      auVar201._12_4_ = uVar104;
      auVar168 = vshufps_avx(auVar177,auVar177,0x55);
      auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
      auVar224._0_4_ = fVar152 * auVar177._0_4_;
      auVar224._4_4_ = fVar151 * auVar177._4_4_;
      auVar224._8_4_ = fVar125 * auVar177._8_4_;
      auVar224._12_4_ = fVar126 * auVar177._12_4_;
      auVar168 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar8,auVar168);
      auVar185 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar7,auVar201);
      auVar168 = vblendps_avx(auVar185,auVar92,8);
      auVar133 = vandps_avx(auVar133,local_450);
      auVar107 = vandps_avx(auVar107,local_450);
      auVar177 = vmaxps_avx(auVar133,auVar107);
      auVar133 = vandps_avx(auVar134,local_450);
      auVar107 = vandps_avx(auVar168,local_450);
      auVar133 = vmaxps_avx(auVar133,auVar107);
      auVar133 = vmaxps_avx(auVar177,auVar133);
      auVar107 = vmovshdup_avx(auVar133);
      auVar107 = vmaxss_avx(auVar107,auVar133);
      auVar133 = vshufpd_avx(auVar133,auVar133,1);
      auVar133 = vmaxss_avx(auVar133,auVar107);
      lVar24 = (long)iVar98 * 0x44;
      auVar107 = vmovshdup_avx(auVar106);
      uVar105 = auVar107._0_8_;
      local_560._8_8_ = uVar105;
      local_560._0_8_ = uVar105;
      local_560._16_8_ = uVar105;
      local_560._24_8_ = uVar105;
      auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      auVar107 = vmovshdup_avx(auVar132);
      uVar105 = auVar107._0_8_;
      local_580._8_8_ = uVar105;
      local_580._0_8_ = uVar105;
      local_580._16_8_ = uVar105;
      local_580._24_8_ = uVar105;
      auVar193 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      uVar218 = auVar176._0_4_;
      local_760._4_4_ = uVar218;
      local_760._0_4_ = uVar218;
      local_760._8_4_ = uVar218;
      local_760._12_4_ = uVar218;
      local_760._16_4_ = uVar218;
      local_760._20_4_ = uVar218;
      local_760._24_4_ = uVar218;
      local_760._28_4_ = uVar218;
      auVar107 = vmovshdup_avx(auVar176);
      uVar105 = auVar107._0_8_;
      local_6c0._8_8_ = uVar105;
      local_6c0._0_8_ = uVar105;
      local_6c0._16_8_ = uVar105;
      local_6c0._24_8_ = uVar105;
      fVar151 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar24 + 0xd8c);
      fVar125 = *(float *)(catmullrom_basis0 + lVar24 + 0xd90);
      fVar126 = *(float *)(catmullrom_basis0 + lVar24 + 0xd94);
      fVar127 = *(float *)(catmullrom_basis0 + lVar24 + 0xd98);
      fVar128 = *(float *)(catmullrom_basis0 + lVar24 + 0xd9c);
      fVar129 = *(float *)(catmullrom_basis0 + lVar24 + 0xda0);
      fVar130 = *(float *)(catmullrom_basis0 + lVar24 + 0xda4);
      auVar96 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_540 = auVar185._0_4_;
      auVar107 = vmovshdup_avx(auVar185);
      uVar105 = auVar107._0_8_;
      auVar142._0_4_ = fVar151 * local_540;
      auVar142._4_4_ = fVar125 * local_540;
      auVar142._8_4_ = fVar126 * local_540;
      auVar142._12_4_ = fVar127 * local_540;
      auVar142._16_4_ = fVar128 * local_540;
      auVar142._20_4_ = fVar129 * local_540;
      auVar142._24_4_ = fVar130 * local_540;
      auVar142._28_4_ = 0;
      local_740 = auVar107._0_4_;
      auVar115._0_4_ = local_740 * fVar151;
      fStack_73c = auVar107._4_4_;
      auVar115._4_4_ = fStack_73c * fVar125;
      auVar115._8_4_ = local_740 * fVar126;
      auVar115._12_4_ = fStack_73c * fVar127;
      auVar115._16_4_ = local_740 * fVar128;
      auVar115._20_4_ = fStack_73c * fVar129;
      auVar115._24_4_ = local_740 * fVar130;
      auVar115._28_4_ = 0;
      auVar107 = vfmadd231ps_fma(auVar142,auVar193,local_760);
      auVar134 = vfmadd231ps_fma(auVar115,auVar193,local_6c0);
      uVar104 = auVar132._0_4_;
      auVar242._4_4_ = uVar104;
      auVar242._0_4_ = uVar104;
      auVar242._8_4_ = uVar104;
      auVar242._12_4_ = uVar104;
      auVar242._16_4_ = uVar104;
      auVar242._20_4_ = uVar104;
      auVar242._24_4_ = uVar104;
      auVar242._28_4_ = uVar104;
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,auVar242);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar122,local_580);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      uVar104 = auVar106._0_4_;
      auVar239._4_4_ = uVar104;
      auVar239._0_4_ = uVar104;
      auVar239._8_4_ = uVar104;
      auVar239._12_4_ = uVar104;
      auVar239._16_4_ = uVar104;
      auVar239._20_4_ = uVar104;
      auVar239._24_4_ = uVar104;
      auVar239._28_4_ = uVar104;
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar115,auVar239);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar115,local_560);
      auVar142 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      fVar77 = *(float *)(catmullrom_basis1 + lVar24 + 0xd8c);
      fVar78 = *(float *)(catmullrom_basis1 + lVar24 + 0xd90);
      fVar79 = *(float *)(catmullrom_basis1 + lVar24 + 0xd94);
      fVar80 = *(float *)(catmullrom_basis1 + lVar24 + 0xd98);
      fVar81 = *(float *)(catmullrom_basis1 + lVar24 + 0xd9c);
      fVar82 = *(float *)(catmullrom_basis1 + lVar24 + 0xda0);
      fVar83 = *(float *)(catmullrom_basis1 + lVar24 + 0xda4);
      auVar9._4_4_ = local_540 * fVar78;
      auVar9._0_4_ = local_540 * fVar77;
      auVar9._8_4_ = local_540 * fVar79;
      auVar9._12_4_ = local_540 * fVar80;
      auVar9._16_4_ = local_540 * fVar81;
      auVar9._20_4_ = local_540 * fVar82;
      auVar9._24_4_ = local_540 * fVar83;
      auVar9._28_4_ = local_540;
      auVar168 = vfmadd231ps_fma(auVar9,auVar142,local_760);
      auVar189._4_4_ = fStack_73c * fVar78;
      auVar189._0_4_ = local_740 * fVar77;
      auVar189._8_4_ = local_740 * fVar79;
      auVar189._12_4_ = fStack_73c * fVar80;
      auVar189._16_4_ = local_740 * fVar81;
      auVar189._20_4_ = fStack_73c * fVar82;
      auVar189._24_4_ = local_740 * fVar83;
      auVar189._28_4_ = uVar218;
      auVar177 = vfmadd231ps_fma(auVar189,auVar142,local_6c0);
      auVar9 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar9,auVar242);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar9,local_580);
      auVar189 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar189,auVar239);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar189,local_560);
      auVar137 = ZEXT1632(auVar168);
      local_480 = ZEXT1632(auVar107);
      auVar165 = vsubps_avx(auVar137,local_480);
      auVar162 = ZEXT1632(auVar177);
      auVar116 = ZEXT1632(auVar134);
      local_4a0 = vsubps_avx(auVar162,auVar116);
      auVar117._0_4_ = auVar165._0_4_ * auVar134._0_4_;
      auVar117._4_4_ = auVar165._4_4_ * auVar134._4_4_;
      auVar117._8_4_ = auVar165._8_4_ * auVar134._8_4_;
      auVar117._12_4_ = auVar165._12_4_ * auVar134._12_4_;
      auVar117._16_4_ = auVar165._16_4_ * 0.0;
      auVar117._20_4_ = auVar165._20_4_ * 0.0;
      auVar117._24_4_ = auVar165._24_4_ * 0.0;
      auVar117._28_4_ = 0;
      fVar223 = local_4a0._0_4_;
      auVar138._0_4_ = fVar223 * auVar107._0_4_;
      fVar227 = local_4a0._4_4_;
      auVar138._4_4_ = fVar227 * auVar107._4_4_;
      fVar230 = local_4a0._8_4_;
      auVar138._8_4_ = fVar230 * auVar107._8_4_;
      fVar232 = local_4a0._12_4_;
      auVar138._12_4_ = fVar232 * auVar107._12_4_;
      fVar234 = local_4a0._16_4_;
      auVar138._16_4_ = fVar234 * 0.0;
      fVar235 = local_4a0._20_4_;
      auVar138._20_4_ = fVar235 * 0.0;
      fVar236 = local_4a0._24_4_;
      auVar138._24_4_ = fVar236 * 0.0;
      auVar138._28_4_ = 0;
      auVar117 = vsubps_avx(auVar117,auVar138);
      auVar107 = vpermilps_avx(*pauVar1,0xff);
      uVar131 = auVar107._0_8_;
      local_80._8_8_ = uVar131;
      local_80._0_8_ = uVar131;
      local_80._16_8_ = uVar131;
      local_80._24_8_ = uVar131;
      auVar134 = vpermilps_avx(*pauVar2,0xff);
      uVar131 = auVar134._0_8_;
      local_a0._8_8_ = uVar131;
      local_a0._0_8_ = uVar131;
      local_a0._16_8_ = uVar131;
      local_a0._24_8_ = uVar131;
      auVar134 = vpermilps_avx(*pauVar3,0xff);
      uVar131 = auVar134._0_8_;
      local_c0._8_8_ = uVar131;
      local_c0._0_8_ = uVar131;
      local_c0._16_8_ = uVar131;
      local_c0._24_8_ = uVar131;
      auVar93._12_4_ = fStack_8d4;
      auVar93._0_12_ = *pauVar4;
      auVar134 = vpermilps_avx(auVar93,0xff);
      local_e0 = auVar134._0_8_;
      fVar152 = auVar134._0_4_;
      auVar196._0_4_ = fVar151 * fVar152;
      fVar151 = auVar134._4_4_;
      auVar196._4_4_ = fVar125 * fVar151;
      auVar196._8_4_ = fVar126 * fVar152;
      auVar196._12_4_ = fVar127 * fVar151;
      auVar196._16_4_ = fVar128 * fVar152;
      auVar196._20_4_ = fVar129 * fVar151;
      auVar196._24_4_ = fVar130 * fVar152;
      auVar196._28_4_ = 0;
      auVar134 = vfmadd231ps_fma(auVar196,local_c0,auVar193);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),local_a0,auVar122);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar115,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar17._4_4_ = fVar151 * fVar78;
      auVar17._0_4_ = fVar152 * fVar77;
      auVar17._8_4_ = fVar152 * fVar79;
      auVar17._12_4_ = fVar151 * fVar80;
      auVar17._16_4_ = fVar152 * fVar81;
      auVar17._20_4_ = fVar151 * fVar82;
      auVar17._24_4_ = fVar152 * fVar83;
      auVar17._28_4_ = auVar115._28_4_;
      auVar168 = vfmadd231ps_fma(auVar17,auVar142,local_c0);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar9,local_a0);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar189,local_80);
      auVar14._4_4_ = fVar227 * fVar227;
      auVar14._0_4_ = fVar223 * fVar223;
      auVar14._8_4_ = fVar230 * fVar230;
      auVar14._12_4_ = fVar232 * fVar232;
      auVar14._16_4_ = fVar234 * fVar234;
      auVar14._20_4_ = fVar235 * fVar235;
      auVar14._24_4_ = fVar236 * fVar236;
      auVar14._28_4_ = auVar107._4_4_;
      auVar107 = vfmadd231ps_fma(auVar14,auVar165,auVar165);
      auVar17 = vmaxps_avx(ZEXT1632(auVar134),ZEXT1632(auVar168));
      auVar21._4_4_ = auVar17._4_4_ * auVar17._4_4_ * auVar107._4_4_;
      auVar21._0_4_ = auVar17._0_4_ * auVar17._0_4_ * auVar107._0_4_;
      auVar21._8_4_ = auVar17._8_4_ * auVar17._8_4_ * auVar107._8_4_;
      auVar21._12_4_ = auVar17._12_4_ * auVar17._12_4_ * auVar107._12_4_;
      auVar21._16_4_ = auVar17._16_4_ * auVar17._16_4_ * 0.0;
      auVar21._20_4_ = auVar17._20_4_ * auVar17._20_4_ * 0.0;
      auVar21._24_4_ = auVar17._24_4_ * auVar17._24_4_ * 0.0;
      auVar21._28_4_ = auVar17._28_4_;
      auVar22._4_4_ = auVar117._4_4_ * auVar117._4_4_;
      auVar22._0_4_ = auVar117._0_4_ * auVar117._0_4_;
      auVar22._8_4_ = auVar117._8_4_ * auVar117._8_4_;
      auVar22._12_4_ = auVar117._12_4_ * auVar117._12_4_;
      auVar22._16_4_ = auVar117._16_4_ * auVar117._16_4_;
      auVar22._20_4_ = auVar117._20_4_ * auVar117._20_4_;
      auVar22._24_4_ = auVar117._24_4_ * auVar117._24_4_;
      auVar22._28_4_ = auVar117._28_4_;
      auVar17 = vcmpps_avx(auVar22,auVar21,2);
      fVar152 = auVar133._0_4_ * 4.7683716e-07;
      auVar118._0_4_ = (float)iVar98;
      local_5e0._4_12_ = auVar176._4_12_;
      local_5e0._0_4_ = auVar118._0_4_;
      local_5e0._16_16_ = auVar114._16_16_;
      auVar118._4_4_ = auVar118._0_4_;
      auVar118._8_4_ = auVar118._0_4_;
      auVar118._12_4_ = auVar118._0_4_;
      auVar118._16_4_ = auVar118._0_4_;
      auVar118._20_4_ = auVar118._0_4_;
      auVar118._24_4_ = auVar118._0_4_;
      auVar118._28_4_ = auVar118._0_4_;
      auVar114 = vcmpps_avx(_DAT_01faff40,auVar118,1);
      auVar133 = vpermilps_avx(auVar106,0xaa);
      uVar131 = auVar133._0_8_;
      local_640._8_8_ = uVar131;
      local_640._0_8_ = uVar131;
      local_640._16_8_ = uVar131;
      local_640._24_8_ = uVar131;
      auVar133 = vpermilps_avx(auVar132,0xaa);
      uVar131 = auVar133._0_8_;
      auVar173._8_8_ = uVar131;
      auVar173._0_8_ = uVar131;
      auVar173._16_8_ = uVar131;
      auVar173._24_8_ = uVar131;
      auVar133 = vshufps_avx(auVar176,auVar176,0xaa);
      uVar131 = auVar133._0_8_;
      auVar221._8_8_ = uVar131;
      auVar221._0_8_ = uVar131;
      auVar221._16_8_ = uVar131;
      auVar221._24_8_ = uVar131;
      auVar133 = vshufps_avx(auVar185,auVar185,0xaa);
      uVar131 = auVar133._0_8_;
      register0x00001508 = uVar131;
      local_780 = uVar131;
      register0x00001510 = uVar131;
      register0x00001518 = uVar131;
      auVar226 = ZEXT3264(_local_780);
      auVar117 = auVar114 & auVar17;
      uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_738 = local_740;
      fStack_734 = fStack_73c;
      fStack_730 = local_740;
      fStack_72c = fStack_73c;
      fStack_728 = local_740;
      fStack_724 = fStack_73c;
      fStack_53c = local_540;
      fStack_538 = local_540;
      fStack_534 = local_540;
      fStack_530 = local_540;
      fStack_52c = local_540;
      fStack_528 = local_540;
      fStack_524 = local_540;
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0x7f,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0xbf,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar117[0x1f]) {
        auVar206 = ZEXT3264(CONCAT428(fStack_73c,
                                      CONCAT424(local_740,
                                                CONCAT420(fStack_73c,
                                                          CONCAT416(local_740,
                                                                    CONCAT412(fStack_73c,
                                                                              CONCAT48(local_740,
                                                                                       uVar105))))))
                           );
      }
      else {
        local_4c0 = vandps_avx(auVar17,auVar114);
        fVar223 = auVar133._0_4_;
        fVar227 = auVar133._4_4_;
        auVar25._4_4_ = fVar227 * fVar78;
        auVar25._0_4_ = fVar223 * fVar77;
        auVar25._8_4_ = fVar223 * fVar79;
        auVar25._12_4_ = fVar227 * fVar80;
        auVar25._16_4_ = fVar223 * fVar81;
        auVar25._20_4_ = fVar227 * fVar82;
        auVar25._24_4_ = fVar223 * fVar83;
        auVar25._28_4_ = local_4c0._28_4_;
        auVar133 = vfmadd213ps_fma(auVar142,auVar221,auVar25);
        auVar133 = vfmadd213ps_fma(auVar9,auVar173,ZEXT1632(auVar133));
        auVar133 = vfmadd213ps_fma(auVar189,local_640,ZEXT1632(auVar133));
        local_4e0 = ZEXT1632(auVar133);
        local_5c0._0_4_ = auVar96._0_4_;
        local_5c0._4_4_ = auVar96._4_4_;
        fStack_5b8 = auVar96._8_4_;
        fStack_5b4 = auVar96._12_4_;
        fStack_5b0 = auVar96._16_4_;
        fStack_5ac = auVar96._20_4_;
        fStack_5a8 = auVar96._24_4_;
        auVar26._4_4_ = fVar227 * (float)local_5c0._4_4_;
        auVar26._0_4_ = fVar223 * (float)local_5c0._0_4_;
        auVar26._8_4_ = fVar223 * fStack_5b8;
        auVar26._12_4_ = fVar227 * fStack_5b4;
        auVar26._16_4_ = fVar223 * fStack_5b0;
        auVar26._20_4_ = fVar227 * fStack_5ac;
        auVar26._24_4_ = fVar223 * fStack_5a8;
        auVar26._28_4_ = local_4c0._28_4_;
        auVar133 = vfmadd213ps_fma(auVar193,auVar221,auVar26);
        auVar133 = vfmadd213ps_fma(auVar122,auVar173,ZEXT1632(auVar133));
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar193 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        fVar151 = *(float *)(catmullrom_basis0 + lVar24 + 0x1f9c);
        fVar125 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa0);
        fVar126 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa4);
        fVar127 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa8);
        fVar128 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fac);
        fVar129 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb0);
        fVar130 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb4);
        auVar188._0_4_ = local_540 * fVar151;
        auVar188._4_4_ = local_540 * fVar125;
        auVar188._8_4_ = local_540 * fVar126;
        auVar188._12_4_ = local_540 * fVar127;
        auVar188._16_4_ = local_540 * fVar128;
        auVar188._20_4_ = local_540 * fVar129;
        auVar188._24_4_ = local_540 * fVar130;
        auVar188._28_4_ = 0;
        auVar204._0_4_ = local_740 * fVar151;
        auVar204._4_4_ = fStack_73c * fVar125;
        auVar204._8_4_ = local_740 * fVar126;
        auVar204._12_4_ = fStack_73c * fVar127;
        auVar204._16_4_ = local_740 * fVar128;
        auVar204._20_4_ = fStack_73c * fVar129;
        auVar204._24_4_ = local_740 * fVar130;
        auVar204._28_4_ = 0;
        auVar214._0_4_ = fVar151 * fVar223;
        auVar214._4_4_ = fVar125 * fVar227;
        auVar214._8_4_ = fVar126 * fVar223;
        auVar214._12_4_ = fVar127 * fVar227;
        auVar214._16_4_ = fVar128 * fVar223;
        auVar214._20_4_ = fVar129 * fVar227;
        auVar214._24_4_ = fVar130 * fVar223;
        auVar214._28_4_ = 0;
        auVar107 = vfmadd231ps_fma(auVar188,auVar193,local_760);
        auVar177 = vfmadd231ps_fma(auVar204,auVar193,local_6c0);
        auVar106 = vfmadd231ps_fma(auVar214,auVar221,auVar193);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,auVar242);
        auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar122,local_580);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar173,auVar122);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar114,auVar239);
        auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar114,local_560);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar114,local_640);
        fVar151 = *(float *)(catmullrom_basis1 + lVar24 + 0x1f9c);
        fVar125 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa0);
        fVar126 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa4);
        fVar127 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa8);
        fVar128 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fac);
        fVar129 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb0);
        fVar130 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb4);
        auVar122._4_4_ = local_540 * fVar125;
        auVar122._0_4_ = local_540 * fVar151;
        auVar122._8_4_ = local_540 * fVar126;
        auVar122._12_4_ = local_540 * fVar127;
        auVar122._16_4_ = local_540 * fVar128;
        auVar122._20_4_ = local_540 * fVar129;
        auVar122._24_4_ = local_540 * fVar130;
        auVar122._28_4_ = local_540;
        auVar193._4_4_ = fStack_73c * fVar125;
        auVar193._0_4_ = local_740 * fVar151;
        auVar193._8_4_ = local_740 * fVar126;
        auVar193._12_4_ = fStack_73c * fVar127;
        auVar193._16_4_ = local_740 * fVar128;
        auVar193._20_4_ = fStack_73c * fVar129;
        auVar193._24_4_ = local_740 * fVar130;
        auVar193._28_4_ = fStack_73c;
        auVar27._4_4_ = fVar227 * fVar125;
        auVar27._0_4_ = fVar223 * fVar151;
        auVar27._8_4_ = fVar223 * fVar126;
        auVar27._12_4_ = fVar227 * fVar127;
        auVar27._16_4_ = fVar223 * fVar128;
        auVar27._20_4_ = fVar227 * fVar129;
        auVar27._24_4_ = fVar223 * fVar130;
        auVar27._28_4_ = fVar227;
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar132 = vfmadd231ps_fma(auVar122,auVar114,local_760);
        auVar176 = vfmadd231ps_fma(auVar193,auVar114,local_6c0);
        auVar185 = vfmadd231ps_fma(auVar27,auVar221,auVar114);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar114,auVar242);
        auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar114,local_580);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar114,auVar173);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar114,auVar239);
        auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar114,local_560);
        auVar139._8_4_ = 0x7fffffff;
        auVar139._0_8_ = 0x7fffffff7fffffff;
        auVar139._12_4_ = 0x7fffffff;
        auVar139._16_4_ = 0x7fffffff;
        auVar139._20_4_ = 0x7fffffff;
        auVar139._24_4_ = 0x7fffffff;
        auVar139._28_4_ = 0x7fffffff;
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),local_640,auVar114);
        auVar114 = vandps_avx(ZEXT1632(auVar107),auVar139);
        auVar122 = vandps_avx(ZEXT1632(auVar177),auVar139);
        auVar122 = vmaxps_avx(auVar114,auVar122);
        auVar114 = vandps_avx(ZEXT1632(auVar106),auVar139);
        auVar114 = vmaxps_avx(auVar122,auVar114);
        auVar163._4_4_ = fVar152;
        auVar163._0_4_ = fVar152;
        auVar163._8_4_ = fVar152;
        auVar163._12_4_ = fVar152;
        auVar163._16_4_ = fVar152;
        auVar163._20_4_ = fVar152;
        auVar163._24_4_ = fVar152;
        auVar163._28_4_ = fVar152;
        auVar114 = vcmpps_avx(auVar114,auVar163,1);
        auVar193 = vblendvps_avx(ZEXT1632(auVar107),auVar165,auVar114);
        auVar142 = vblendvps_avx(ZEXT1632(auVar177),local_4a0,auVar114);
        auVar114 = vandps_avx(ZEXT1632(auVar132),auVar139);
        auVar122 = vandps_avx(ZEXT1632(auVar176),auVar139);
        auVar9 = vmaxps_avx(auVar114,auVar122);
        auVar114 = vandps_avx(ZEXT1632(auVar185),auVar139);
        auVar114 = vmaxps_avx(auVar9,auVar114);
        auVar189 = vcmpps_avx(auVar114,auVar163,1);
        auVar114 = vblendvps_avx(ZEXT1632(auVar132),auVar165,auVar189);
        auVar9 = vblendvps_avx(ZEXT1632(auVar176),local_4a0,auVar189);
        auVar133 = vfmadd213ps_fma(auVar115,local_640,ZEXT1632(auVar133));
        auVar107 = vfmadd213ps_fma(auVar193,auVar193,ZEXT832(0) << 0x20);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar142,auVar142);
        auVar115 = vrsqrtps_avx(ZEXT1632(auVar107));
        fVar151 = auVar115._0_4_;
        fVar125 = auVar115._4_4_;
        fVar126 = auVar115._8_4_;
        fVar127 = auVar115._12_4_;
        fVar128 = auVar115._16_4_;
        fVar129 = auVar115._20_4_;
        fVar130 = auVar115._24_4_;
        auVar28._4_4_ = fVar125 * fVar125 * fVar125 * auVar107._4_4_ * -0.5;
        auVar28._0_4_ = fVar151 * fVar151 * fVar151 * auVar107._0_4_ * -0.5;
        auVar28._8_4_ = fVar126 * fVar126 * fVar126 * auVar107._8_4_ * -0.5;
        auVar28._12_4_ = fVar127 * fVar127 * fVar127 * auVar107._12_4_ * -0.5;
        auVar28._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar28._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar28._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar28._28_4_ = auVar122._28_4_;
        auVar240._8_4_ = 0x3fc00000;
        auVar240._0_8_ = 0x3fc000003fc00000;
        auVar240._12_4_ = 0x3fc00000;
        auVar240._16_4_ = 0x3fc00000;
        auVar240._20_4_ = 0x3fc00000;
        auVar240._24_4_ = 0x3fc00000;
        auVar240._28_4_ = 0x3fc00000;
        auVar107 = vfmadd231ps_fma(auVar28,auVar240,auVar115);
        fVar151 = auVar107._0_4_;
        fVar125 = auVar107._4_4_;
        auVar29._4_4_ = fVar125 * auVar142._4_4_;
        auVar29._0_4_ = fVar151 * auVar142._0_4_;
        fVar126 = auVar107._8_4_;
        auVar29._8_4_ = fVar126 * auVar142._8_4_;
        fVar127 = auVar107._12_4_;
        auVar29._12_4_ = fVar127 * auVar142._12_4_;
        auVar29._16_4_ = auVar142._16_4_ * 0.0;
        auVar29._20_4_ = auVar142._20_4_ * 0.0;
        auVar29._24_4_ = auVar142._24_4_ * 0.0;
        auVar29._28_4_ = 0;
        auVar30._4_4_ = fVar125 * -auVar193._4_4_;
        auVar30._0_4_ = fVar151 * -auVar193._0_4_;
        auVar30._8_4_ = fVar126 * -auVar193._8_4_;
        auVar30._12_4_ = fVar127 * -auVar193._12_4_;
        auVar30._16_4_ = -auVar193._16_4_ * 0.0;
        auVar30._20_4_ = -auVar193._20_4_ * 0.0;
        auVar30._24_4_ = -auVar193._24_4_ * 0.0;
        auVar30._28_4_ = auVar115._28_4_;
        auVar107 = vfmadd213ps_fma(auVar114,auVar114,ZEXT832(0) << 0x20);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar9,auVar9);
        auVar122 = vrsqrtps_avx(ZEXT1632(auVar107));
        auVar31._28_4_ = auVar189._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * 0.0,
                                CONCAT48(fVar126 * 0.0,CONCAT44(fVar125 * 0.0,fVar151 * 0.0))));
        fVar151 = auVar122._0_4_;
        fVar125 = auVar122._4_4_;
        fVar126 = auVar122._8_4_;
        fVar127 = auVar122._12_4_;
        fVar128 = auVar122._16_4_;
        fVar129 = auVar122._20_4_;
        fVar130 = auVar122._24_4_;
        auVar32._4_4_ = fVar125 * fVar125 * fVar125 * auVar107._4_4_ * -0.5;
        auVar32._0_4_ = fVar151 * fVar151 * fVar151 * auVar107._0_4_ * -0.5;
        auVar32._8_4_ = fVar126 * fVar126 * fVar126 * auVar107._8_4_ * -0.5;
        auVar32._12_4_ = fVar127 * fVar127 * fVar127 * auVar107._12_4_ * -0.5;
        auVar32._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar32._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar32._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar32._28_4_ = 0;
        auVar107 = vfmadd231ps_fma(auVar32,auVar240,auVar122);
        fVar151 = auVar107._0_4_;
        auVar215._0_4_ = auVar9._0_4_ * fVar151;
        fVar125 = auVar107._4_4_;
        auVar215._4_4_ = auVar9._4_4_ * fVar125;
        fVar126 = auVar107._8_4_;
        auVar215._8_4_ = auVar9._8_4_ * fVar126;
        fVar127 = auVar107._12_4_;
        auVar215._12_4_ = auVar9._12_4_ * fVar127;
        auVar215._16_4_ = auVar9._16_4_ * 0.0;
        auVar215._20_4_ = auVar9._20_4_ * 0.0;
        auVar215._24_4_ = auVar9._24_4_ * 0.0;
        auVar215._28_4_ = 0;
        auVar33._4_4_ = -auVar114._4_4_ * fVar125;
        auVar33._0_4_ = -auVar114._0_4_ * fVar151;
        auVar33._8_4_ = -auVar114._8_4_ * fVar126;
        auVar33._12_4_ = -auVar114._12_4_ * fVar127;
        auVar33._16_4_ = -auVar114._16_4_ * 0.0;
        auVar33._20_4_ = -auVar114._20_4_ * 0.0;
        auVar33._24_4_ = -auVar114._24_4_ * 0.0;
        auVar33._28_4_ = auVar9._28_4_;
        auVar34._28_4_ = auVar122._28_4_;
        auVar34._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * 0.0,
                                CONCAT48(fVar126 * 0.0,CONCAT44(fVar125 * 0.0,fVar151 * 0.0))));
        auVar107 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar134),local_480);
        auVar114 = ZEXT1632(auVar134);
        auVar177 = vfmadd213ps_fma(auVar30,auVar114,auVar116);
        auVar106 = vfmadd213ps_fma(auVar31,auVar114,ZEXT1632(auVar133));
        auVar185 = vfnmadd213ps_fma(auVar29,auVar114,local_480);
        auVar132 = vfmadd213ps_fma(auVar215,ZEXT1632(auVar168),auVar137);
        auVar186 = vfnmadd213ps_fma(auVar30,auVar114,auVar116);
        auVar114 = ZEXT1632(auVar168);
        auVar176 = vfmadd213ps_fma(auVar33,auVar114,auVar162);
        auVar196 = ZEXT1632(auVar134);
        auVar202 = vfnmadd231ps_fma(ZEXT1632(auVar133),auVar196,auVar31);
        auVar134 = vfmadd213ps_fma(auVar34,auVar114,local_4e0);
        auVar187 = vfnmadd213ps_fma(auVar215,auVar114,auVar137);
        auVar199 = vfnmadd213ps_fma(auVar33,auVar114,auVar162);
        local_5a0 = ZEXT1632(auVar168);
        auVar203 = vfnmadd231ps_fma(local_4e0,local_5a0,auVar34);
        auVar114 = vsubps_avx(ZEXT1632(auVar176),ZEXT1632(auVar186));
        auVar122 = vsubps_avx(ZEXT1632(auVar134),ZEXT1632(auVar202));
        auVar116._4_4_ = auVar202._4_4_ * auVar114._4_4_;
        auVar116._0_4_ = auVar202._0_4_ * auVar114._0_4_;
        auVar116._8_4_ = auVar202._8_4_ * auVar114._8_4_;
        auVar116._12_4_ = auVar202._12_4_ * auVar114._12_4_;
        auVar116._16_4_ = auVar114._16_4_ * 0.0;
        auVar116._20_4_ = auVar114._20_4_ * 0.0;
        auVar116._24_4_ = auVar114._24_4_ * 0.0;
        auVar116._28_4_ = 0;
        auVar168 = vfmsub231ps_fma(auVar116,ZEXT1632(auVar186),auVar122);
        auVar137._4_4_ = auVar122._4_4_ * auVar185._4_4_;
        auVar137._0_4_ = auVar122._0_4_ * auVar185._0_4_;
        auVar137._8_4_ = auVar122._8_4_ * auVar185._8_4_;
        auVar137._12_4_ = auVar122._12_4_ * auVar185._12_4_;
        auVar137._16_4_ = auVar122._16_4_ * 0.0;
        auVar137._20_4_ = auVar122._20_4_ * 0.0;
        auVar137._24_4_ = auVar122._24_4_ * 0.0;
        auVar137._28_4_ = auVar122._28_4_;
        auVar122 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar185));
        auVar133 = vfmsub231ps_fma(auVar137,ZEXT1632(auVar202),auVar122);
        auVar162._4_4_ = auVar186._4_4_ * auVar122._4_4_;
        auVar162._0_4_ = auVar186._0_4_ * auVar122._0_4_;
        auVar162._8_4_ = auVar186._8_4_ * auVar122._8_4_;
        auVar162._12_4_ = auVar186._12_4_ * auVar122._12_4_;
        auVar162._16_4_ = auVar122._16_4_ * 0.0;
        auVar162._20_4_ = auVar122._20_4_ * 0.0;
        auVar162._24_4_ = auVar122._24_4_ * 0.0;
        auVar162._28_4_ = auVar122._28_4_;
        auVar189 = ZEXT1632(auVar185);
        auVar185 = vfmsub231ps_fma(auVar162,auVar189,auVar114);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar185),ZEXT832(0) << 0x20,ZEXT1632(auVar133));
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT832(0) << 0x20,ZEXT1632(auVar168));
        auVar14 = vcmpps_avx(ZEXT1632(auVar133),ZEXT832(0) << 0x20,2);
        auVar114 = vblendvps_avx(ZEXT1632(auVar187),ZEXT1632(auVar107),auVar14);
        auVar122 = vblendvps_avx(ZEXT1632(auVar199),ZEXT1632(auVar177),auVar14);
        auVar193 = vblendvps_avx(ZEXT1632(auVar203),ZEXT1632(auVar106),auVar14);
        auVar115 = vblendvps_avx(auVar189,ZEXT1632(auVar132),auVar14);
        auVar142 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar176),auVar14);
        auVar9 = vblendvps_avx(ZEXT1632(auVar202),ZEXT1632(auVar134),auVar14);
        auVar189 = vblendvps_avx(ZEXT1632(auVar132),auVar189,auVar14);
        auVar17 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar186),auVar14);
        auVar133 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        local_7c0 = ZEXT1632(auVar133);
        auVar117 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar202),auVar14);
        auVar21 = vsubps_avx(auVar189,auVar114);
        auVar22 = vsubps_avx(auVar17,auVar122);
        auVar116 = vsubps_avx(auVar117,auVar193);
        auVar137 = vsubps_avx(auVar114,auVar115);
        auVar138 = vsubps_avx(auVar122,auVar142);
        auVar162 = vsubps_avx(auVar193,auVar9);
        auVar35._4_4_ = auVar116._4_4_ * auVar114._4_4_;
        auVar35._0_4_ = auVar116._0_4_ * auVar114._0_4_;
        auVar35._8_4_ = auVar116._8_4_ * auVar114._8_4_;
        auVar35._12_4_ = auVar116._12_4_ * auVar114._12_4_;
        auVar35._16_4_ = auVar116._16_4_ * auVar114._16_4_;
        auVar35._20_4_ = auVar116._20_4_ * auVar114._20_4_;
        auVar35._24_4_ = auVar116._24_4_ * auVar114._24_4_;
        auVar35._28_4_ = auVar117._28_4_;
        auVar107 = vfmsub231ps_fma(auVar35,auVar193,auVar21);
        auVar36._4_4_ = auVar21._4_4_ * auVar122._4_4_;
        auVar36._0_4_ = auVar21._0_4_ * auVar122._0_4_;
        auVar36._8_4_ = auVar21._8_4_ * auVar122._8_4_;
        auVar36._12_4_ = auVar21._12_4_ * auVar122._12_4_;
        auVar36._16_4_ = auVar21._16_4_ * auVar122._16_4_;
        auVar36._20_4_ = auVar21._20_4_ * auVar122._20_4_;
        auVar36._24_4_ = auVar21._24_4_ * auVar122._24_4_;
        auVar36._28_4_ = auVar189._28_4_;
        auVar134 = vfmsub231ps_fma(auVar36,auVar114,auVar22);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar134),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
        auVar119._0_4_ = auVar22._0_4_ * auVar193._0_4_;
        auVar119._4_4_ = auVar22._4_4_ * auVar193._4_4_;
        auVar119._8_4_ = auVar22._8_4_ * auVar193._8_4_;
        auVar119._12_4_ = auVar22._12_4_ * auVar193._12_4_;
        auVar119._16_4_ = auVar22._16_4_ * auVar193._16_4_;
        auVar119._20_4_ = auVar22._20_4_ * auVar193._20_4_;
        auVar119._24_4_ = auVar22._24_4_ * auVar193._24_4_;
        auVar119._28_4_ = 0;
        auVar134 = vfmsub231ps_fma(auVar119,auVar122,auVar116);
        auVar134 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar134));
        auVar120._0_4_ = auVar162._0_4_ * auVar115._0_4_;
        auVar120._4_4_ = auVar162._4_4_ * auVar115._4_4_;
        auVar120._8_4_ = auVar162._8_4_ * auVar115._8_4_;
        auVar120._12_4_ = auVar162._12_4_ * auVar115._12_4_;
        auVar120._16_4_ = auVar162._16_4_ * auVar115._16_4_;
        auVar120._20_4_ = auVar162._20_4_ * auVar115._20_4_;
        auVar120._24_4_ = auVar162._24_4_ * auVar115._24_4_;
        auVar120._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar120,auVar137,auVar9);
        auVar37._4_4_ = auVar138._4_4_ * auVar9._4_4_;
        auVar37._0_4_ = auVar138._0_4_ * auVar9._0_4_;
        auVar37._8_4_ = auVar138._8_4_ * auVar9._8_4_;
        auVar37._12_4_ = auVar138._12_4_ * auVar9._12_4_;
        auVar37._16_4_ = auVar138._16_4_ * auVar9._16_4_;
        auVar37._20_4_ = auVar138._20_4_ * auVar9._20_4_;
        auVar37._24_4_ = auVar138._24_4_ * auVar9._24_4_;
        auVar37._28_4_ = auVar9._28_4_;
        auVar168 = vfmsub231ps_fma(auVar37,auVar142,auVar162);
        auVar38._4_4_ = auVar137._4_4_ * auVar142._4_4_;
        auVar38._0_4_ = auVar137._0_4_ * auVar142._0_4_;
        auVar38._8_4_ = auVar137._8_4_ * auVar142._8_4_;
        auVar38._12_4_ = auVar137._12_4_ * auVar142._12_4_;
        auVar38._16_4_ = auVar137._16_4_ * auVar142._16_4_;
        auVar38._20_4_ = auVar137._20_4_ * auVar142._20_4_;
        auVar38._24_4_ = auVar137._24_4_ * auVar142._24_4_;
        auVar38._28_4_ = auVar17._28_4_;
        auVar177 = vfmsub231ps_fma(auVar38,auVar138,auVar115);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar168));
        auVar115 = vmaxps_avx(ZEXT1632(auVar134),ZEXT1632(auVar168));
        auVar115 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
        auVar107 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar133 = vpand_avx(auVar107,auVar133);
        auVar115 = vpmovsxwd_avx2(auVar133);
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) {
LAB_0161e535:
          auVar184._8_8_ = local_680[1]._8_8_;
          auVar184._0_8_ = local_680[1]._0_8_;
          auVar184._16_8_ = local_680[1]._16_8_;
          auVar184._24_8_ = local_680[1]._24_8_;
          auVar208._8_4_ = local_740;
          auVar208._0_8_ = uVar105;
          auVar208._12_4_ = fStack_73c;
          auVar208._16_4_ = local_740;
          auVar208._20_4_ = fStack_73c;
          auVar208._24_4_ = local_740;
          auVar208._28_4_ = fStack_73c;
        }
        else {
          auVar39._4_4_ = auVar22._4_4_ * auVar162._4_4_;
          auVar39._0_4_ = auVar22._0_4_ * auVar162._0_4_;
          auVar39._8_4_ = auVar22._8_4_ * auVar162._8_4_;
          auVar39._12_4_ = auVar22._12_4_ * auVar162._12_4_;
          auVar39._16_4_ = auVar22._16_4_ * auVar162._16_4_;
          auVar39._20_4_ = auVar22._20_4_ * auVar162._20_4_;
          auVar39._24_4_ = auVar22._24_4_ * auVar162._24_4_;
          auVar39._28_4_ = auVar115._28_4_;
          auVar132 = vfmsub231ps_fma(auVar39,auVar138,auVar116);
          auVar140._0_4_ = auVar116._0_4_ * auVar137._0_4_;
          auVar140._4_4_ = auVar116._4_4_ * auVar137._4_4_;
          auVar140._8_4_ = auVar116._8_4_ * auVar137._8_4_;
          auVar140._12_4_ = auVar116._12_4_ * auVar137._12_4_;
          auVar140._16_4_ = auVar116._16_4_ * auVar137._16_4_;
          auVar140._20_4_ = auVar116._20_4_ * auVar137._20_4_;
          auVar140._24_4_ = auVar116._24_4_ * auVar137._24_4_;
          auVar140._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar140,auVar21,auVar162);
          auVar40._4_4_ = auVar21._4_4_ * auVar138._4_4_;
          auVar40._0_4_ = auVar21._0_4_ * auVar138._0_4_;
          auVar40._8_4_ = auVar21._8_4_ * auVar138._8_4_;
          auVar40._12_4_ = auVar21._12_4_ * auVar138._12_4_;
          auVar40._16_4_ = auVar21._16_4_ * auVar138._16_4_;
          auVar40._20_4_ = auVar21._20_4_ * auVar138._20_4_;
          auVar40._24_4_ = auVar21._24_4_ * auVar138._24_4_;
          auVar40._28_4_ = auVar142._28_4_;
          auVar176 = vfmsub231ps_fma(auVar40,auVar137,auVar22);
          auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar106),ZEXT1632(auVar176));
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar132),ZEXT832(0) << 0x20);
          auVar115 = vrcpps_avx(ZEXT1632(auVar177));
          auVar216._8_4_ = 0x3f800000;
          auVar216._0_8_ = 0x3f8000003f800000;
          auVar216._12_4_ = 0x3f800000;
          auVar216._16_4_ = 0x3f800000;
          auVar216._20_4_ = 0x3f800000;
          auVar216._24_4_ = 0x3f800000;
          auVar216._28_4_ = 0x3f800000;
          auVar107 = vfnmadd213ps_fma(auVar115,ZEXT1632(auVar177),auVar216);
          auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar115,auVar115);
          auVar197._0_4_ = auVar176._0_4_ * auVar193._0_4_;
          auVar197._4_4_ = auVar176._4_4_ * auVar193._4_4_;
          auVar197._8_4_ = auVar176._8_4_ * auVar193._8_4_;
          auVar197._12_4_ = auVar176._12_4_ * auVar193._12_4_;
          auVar197._16_4_ = auVar193._16_4_ * 0.0;
          auVar197._20_4_ = auVar193._20_4_ * 0.0;
          auVar197._24_4_ = auVar193._24_4_ * 0.0;
          auVar197._28_4_ = 0;
          auVar106 = vfmadd231ps_fma(auVar197,auVar122,ZEXT1632(auVar106));
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar132),auVar114);
          fVar151 = auVar107._0_4_;
          fVar125 = auVar107._4_4_;
          fVar126 = auVar107._8_4_;
          fVar127 = auVar107._12_4_;
          auVar193 = ZEXT1632(CONCAT412(fVar127 * auVar106._12_4_,
                                        CONCAT48(fVar126 * auVar106._8_4_,
                                                 CONCAT44(fVar125 * auVar106._4_4_,
                                                          fVar151 * auVar106._0_4_))));
          auVar121._4_4_ = uVar104;
          auVar121._0_4_ = uVar104;
          auVar121._8_4_ = uVar104;
          auVar121._12_4_ = uVar104;
          auVar121._16_4_ = uVar104;
          auVar121._20_4_ = uVar104;
          auVar121._24_4_ = uVar104;
          auVar121._28_4_ = uVar104;
          uVar218 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar141._4_4_ = uVar218;
          auVar141._0_4_ = uVar218;
          auVar141._8_4_ = uVar218;
          auVar141._12_4_ = uVar218;
          auVar141._16_4_ = uVar218;
          auVar141._20_4_ = uVar218;
          auVar141._24_4_ = uVar218;
          auVar141._28_4_ = uVar218;
          auVar114 = vcmpps_avx(auVar121,auVar193,2);
          auVar122 = vcmpps_avx(auVar193,auVar141,2);
          auVar114 = vandps_avx(auVar122,auVar114);
          auVar107 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
          auVar133 = vpand_avx(auVar133,auVar107);
          auVar114 = vpmovsxwd_avx2(auVar133);
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0x7f,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0xbf,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar114[0x1f]) goto LAB_0161e535;
          auVar114 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar177),4);
          auVar107 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
          auVar133 = vpand_avx(auVar133,auVar107);
          auVar114 = vpmovsxwd_avx2(auVar133);
          auVar184._8_8_ = local_680[1]._8_8_;
          auVar184._0_8_ = local_680[1]._0_8_;
          auVar184._16_8_ = local_680[1]._16_8_;
          auVar184._24_8_ = local_680[1]._24_8_;
          auVar208._8_4_ = local_740;
          auVar208._0_8_ = uVar105;
          auVar208._12_4_ = fStack_73c;
          auVar208._16_4_ = local_740;
          auVar208._20_4_ = fStack_73c;
          auVar208._24_4_ = local_740;
          auVar208._28_4_ = fStack_73c;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            auVar115 = ZEXT1632(CONCAT412(fVar127 * auVar134._12_4_,
                                          CONCAT48(fVar126 * auVar134._8_4_,
                                                   CONCAT44(fVar125 * auVar134._4_4_,
                                                            fVar151 * auVar134._0_4_))));
            auVar142 = ZEXT1632(CONCAT412(fVar127 * auVar168._12_4_,
                                          CONCAT48(fVar126 * auVar168._8_4_,
                                                   CONCAT44(fVar125 * auVar168._4_4_,
                                                            fVar151 * auVar168._0_4_))));
            auVar183._8_4_ = 0x3f800000;
            auVar183._0_8_ = 0x3f8000003f800000;
            auVar183._12_4_ = 0x3f800000;
            auVar183._16_4_ = 0x3f800000;
            auVar183._20_4_ = 0x3f800000;
            auVar183._24_4_ = 0x3f800000;
            auVar183._28_4_ = 0x3f800000;
            auVar122 = vsubps_avx(auVar183,auVar115);
            _local_2e0 = vblendvps_avx(auVar122,auVar115,auVar14);
            auVar122 = vsubps_avx(auVar183,auVar142);
            local_500 = vblendvps_avx(auVar122,auVar142,auVar14);
            auVar184 = auVar114;
            local_600 = auVar193;
          }
        }
        auVar226 = ZEXT3264(_local_780);
        auVar217 = ZEXT3264(auVar173);
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0x7f,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0xbf,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar184[0x1f] < '\0') {
          auVar114 = vsubps_avx(local_5a0,auVar196);
          auVar133 = vfmadd213ps_fma(auVar114,_local_2e0,auVar196);
          fVar151 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar41._4_4_ = (auVar133._4_4_ + auVar133._4_4_) * fVar151;
          auVar41._0_4_ = (auVar133._0_4_ + auVar133._0_4_) * fVar151;
          auVar41._8_4_ = (auVar133._8_4_ + auVar133._8_4_) * fVar151;
          auVar41._12_4_ = (auVar133._12_4_ + auVar133._12_4_) * fVar151;
          auVar41._16_4_ = fVar151 * 0.0;
          auVar41._20_4_ = fVar151 * 0.0;
          auVar41._24_4_ = fVar151 * 0.0;
          auVar41._28_4_ = 0;
          auVar114 = vcmpps_avx(local_600,auVar41,6);
          auVar122 = auVar184 & auVar114;
          auVar222 = ZEXT3264(auVar221);
          auVar206 = ZEXT3264(auVar208);
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            auVar143._8_4_ = 0xbf800000;
            auVar143._0_8_ = 0xbf800000bf800000;
            auVar143._12_4_ = 0xbf800000;
            auVar143._16_4_ = 0xbf800000;
            auVar143._20_4_ = 0xbf800000;
            auVar143._24_4_ = 0xbf800000;
            auVar143._28_4_ = 0xbf800000;
            auVar164._8_4_ = 0x40000000;
            auVar164._0_8_ = 0x4000000040000000;
            auVar164._12_4_ = 0x40000000;
            auVar164._16_4_ = 0x40000000;
            auVar164._20_4_ = 0x40000000;
            auVar164._24_4_ = 0x40000000;
            auVar164._28_4_ = 0x40000000;
            auVar133 = vfmadd213ps_fma(local_500,auVar164,auVar143);
            local_440 = _local_2e0;
            local_420 = ZEXT1632(auVar133);
            local_400 = local_600;
            local_3e0 = 0;
            local_500 = local_420;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar114,auVar184);
              fVar151 = 1.0 / auVar118._0_4_;
              local_360[0] = fVar151 * ((float)local_2e0._0_4_ + 0.0);
              local_360[1] = fVar151 * ((float)local_2e0._4_4_ + 1.0);
              local_360[2] = fVar151 * (fStack_2d8 + 2.0);
              local_360[3] = fVar151 * (fStack_2d4 + 3.0);
              fStack_350 = fVar151 * (fStack_2d0 + 4.0);
              fStack_34c = fVar151 * (fStack_2cc + 5.0);
              fStack_348 = fVar151 * (fStack_2c8 + 6.0);
              fStack_344 = fStack_2c4 + 7.0;
              local_500._0_8_ = auVar133._0_8_;
              local_500._8_8_ = auVar133._8_8_;
              local_340 = local_500._0_8_;
              uStack_338 = local_500._8_8_;
              uStack_330 = 0;
              uStack_328 = 0;
              local_320 = local_600;
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar114 = vblendvps_avx(auVar144,local_600,local_6a0);
              auVar122 = vshufps_avx(auVar114,auVar114,0xb1);
              auVar122 = vminps_avx(auVar114,auVar122);
              auVar193 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar193);
              auVar193 = vpermpd_avx2(auVar122,0x4e);
              auVar122 = vminps_avx(auVar122,auVar193);
              auVar122 = vcmpps_avx(auVar114,auVar122,0);
              auVar193 = local_6a0 & auVar122;
              auVar114 = local_6a0;
              if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar193 >> 0x7f,0) != '\0') ||
                    (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar193 >> 0xbf,0) != '\0') ||
                  (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar193[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar122,local_6a0);
              }
              uVar99 = vmovmskps_avx(auVar114);
              uVar23 = 0;
              for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                uVar23 = uVar23 + 1;
              }
              uVar100 = (ulong)uVar23;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar151 = local_360[uVar100];
                fVar125 = 1.0 - fVar151;
                auVar111 = ZEXT416((uint)fVar151);
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                          ZEXT416(0xc0a00000));
                auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                          ZEXT416((uint)(fVar151 + fVar151)),auVar15);
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                          ZEXT416(0x40000000));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125 * -3.0)),
                                          ZEXT416((uint)(fVar125 + fVar125)),auVar15);
                auVar133 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar125 + fVar125))),
                                            ZEXT416((uint)fVar125),ZEXT416((uint)fVar125));
                auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar111,
                                           ZEXT416((uint)(fVar125 * -2.0)));
                fVar125 = auVar15._0_4_ * 0.5;
                fVar126 = auVar111._0_4_ * 0.5;
                auVar169._0_4_ = fVar126 * local_8e0;
                auVar169._4_4_ = fVar126 * fStack_8dc;
                auVar169._8_4_ = fVar126 * fStack_8d8;
                auVar169._12_4_ = fVar126 * fStack_8d4;
                auVar135._4_4_ = fVar125;
                auVar135._0_4_ = fVar125;
                auVar135._8_4_ = fVar125;
                auVar135._12_4_ = fVar125;
                auVar15 = vfmadd132ps_fma(auVar135,auVar169,*pauVar3);
                fVar125 = auVar16._0_4_ * 0.5;
                auVar170._4_4_ = fVar125;
                auVar170._0_4_ = fVar125;
                auVar170._8_4_ = fVar125;
                auVar170._12_4_ = fVar125;
                auVar15 = vfmadd132ps_fma(auVar170,auVar15,*pauVar2);
                uVar218 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                fVar125 = auVar133._0_4_ * 0.5;
                auVar154._4_4_ = fVar125;
                auVar154._0_4_ = fVar125;
                auVar154._8_4_ = fVar125;
                auVar154._12_4_ = fVar125;
                auVar15 = vfmadd132ps_fma(auVar154,auVar15,*pauVar1);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar100 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar15._0_4_;
                uVar229 = vextractps_avx(auVar15,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar229;
                uVar229 = vextractps_avx(auVar15,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar229;
                *(float *)(ray + k * 4 + 0x1e0) = fVar151;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar218;
                *(uint *)(ray + k * 4 + 0x220) = uVar11;
                *(uint *)(ray + k * 4 + 0x240) = uVar97;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_7e0._4_4_ = uVar97;
                local_7e0._0_4_ = uVar97;
                local_7e0._8_4_ = uVar97;
                local_7e0._12_4_ = uVar97;
                local_7e0._16_4_ = uVar97;
                local_7e0._20_4_ = uVar97;
                local_7e0._24_4_ = uVar97;
                local_7e0._28_4_ = uVar97;
                local_6e0._4_4_ = uVar11;
                local_6e0._0_4_ = uVar11;
                local_6e0._8_4_ = uVar11;
                local_6e0._12_4_ = uVar11;
                local_6e0._16_4_ = uVar11;
                local_6e0._20_4_ = uVar11;
                local_6e0._24_4_ = uVar11;
                local_6e0._28_4_ = uVar11;
                uVar218 = *(undefined4 *)(ray + k * 4 + 0x100);
                uVar229 = 0;
                uVar231 = 0;
                uVar233 = 0;
                local_790 = ray;
                local_720 = auVar173;
                local_700 = auVar221;
                _local_5c0 = auVar165;
                local_3dc = iVar98;
                local_3d0 = uVar84;
                uStack_3c8 = uVar85;
                local_3c0 = uVar86;
                uStack_3b8 = uVar87;
                local_3b0 = uVar88;
                uStack_3a8 = uVar89;
                local_3a0 = uVar90;
                uStack_398 = uVar91;
                while( true ) {
                  auVar122 = local_7c0;
                  fVar151 = local_360[uVar100];
                  auVar113._4_4_ = fVar151;
                  auVar113._0_4_ = fVar151;
                  auVar113._8_4_ = fVar151;
                  auVar113._12_4_ = fVar151;
                  local_260._16_4_ = fVar151;
                  local_260._0_16_ = auVar113;
                  local_260._20_4_ = fVar151;
                  local_260._24_4_ = fVar151;
                  local_260._28_4_ = fVar151;
                  local_240 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar100 * 4);
                  fVar125 = 1.0 - fVar151;
                  auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,
                                             ZEXT416(0xc0a00000));
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                             ZEXT416((uint)(fVar151 + fVar151)),auVar133);
                  auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,
                                             ZEXT416(0x40000000));
                  auVar133 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125 * -3.0)),
                                             ZEXT416((uint)(fVar125 + fVar125)),auVar133);
                  auVar168 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar125 + fVar125))),
                                              ZEXT416((uint)fVar125),ZEXT416((uint)fVar125));
                  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar113,
                                             ZEXT416((uint)(fVar125 * -2.0)));
                  fVar151 = auVar133._0_4_ * 0.5;
                  fVar125 = auVar134._0_4_ * 0.5;
                  auVar181._0_4_ = fVar125 * local_8e0;
                  auVar181._4_4_ = fVar125 * fStack_8dc;
                  auVar181._8_4_ = fVar125 * fStack_8d8;
                  auVar181._12_4_ = fVar125 * fStack_8d4;
                  auVar159._4_4_ = fVar151;
                  auVar159._0_4_ = fVar151;
                  auVar159._8_4_ = fVar151;
                  auVar159._12_4_ = fVar151;
                  auVar133 = vfmadd132ps_fma(auVar159,auVar181,auVar15);
                  fVar151 = auVar107._0_4_ * 0.5;
                  auVar182._4_4_ = fVar151;
                  auVar182._0_4_ = fVar151;
                  auVar182._8_4_ = fVar151;
                  auVar182._12_4_ = fVar151;
                  auVar133 = vfmadd132ps_fma(auVar182,auVar133,auVar16);
                  local_810.context = context->user;
                  fVar151 = auVar168._0_4_ * 0.5;
                  auVar160._4_4_ = fVar151;
                  auVar160._0_4_ = fVar151;
                  auVar160._8_4_ = fVar151;
                  auVar160._12_4_ = fVar151;
                  auVar107 = vfmadd132ps_fma(auVar160,auVar133,auVar111);
                  local_2c0 = auVar107._0_4_;
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  uStack_2b0 = local_2c0;
                  uStack_2ac = local_2c0;
                  uStack_2a8 = local_2c0;
                  uStack_2a4 = local_2c0;
                  auVar133 = vmovshdup_avx(auVar107);
                  local_2a0 = auVar133._0_8_;
                  uStack_298 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_288 = local_2a0;
                  auVar133 = vshufps_avx(auVar107,auVar107,0xaa);
                  auVar161._0_8_ = auVar133._0_8_;
                  auVar161._8_8_ = auVar161._0_8_;
                  auVar165._16_8_ = auVar161._0_8_;
                  auVar165._0_16_ = auVar161;
                  auVar165._24_8_ = auVar161._0_8_;
                  local_280 = auVar165;
                  uStack_23c = local_240;
                  uStack_238 = local_240;
                  uStack_234 = local_240;
                  uStack_230 = local_240;
                  uStack_22c = local_240;
                  uStack_228 = local_240;
                  uStack_224 = local_240;
                  local_220 = local_6e0._0_8_;
                  uStack_218 = local_6e0._8_8_;
                  uStack_210 = local_6e0._16_8_;
                  uStack_208 = local_6e0._24_8_;
                  local_200 = local_7e0;
                  auVar114 = vpcmpeqd_avx2(local_7e0,local_7e0);
                  local_788[1] = auVar114;
                  *local_788 = auVar114;
                  local_1e0 = (local_810.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_810.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_680[0] = local_300;
                  local_810.valid = (int *)local_680;
                  local_810.geometryUserPtr = pGVar12->userPtr;
                  local_810.hit = (RTCHitN *)&local_2c0;
                  local_810.N = 8;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_7c0._4_4_ = uVar229;
                    local_7c0._0_4_ = uVar218;
                    local_7c0._8_4_ = uVar231;
                    local_7c0._16_16_ = auVar122._16_16_;
                    local_7c0._12_4_ = uVar233;
                    auVar165 = ZEXT1632(auVar161);
                    (*pGVar12->intersectionFilterN)(&local_810);
                    auVar226 = ZEXT3264(_local_780);
                    auVar222 = ZEXT3264(local_700);
                    auVar217 = ZEXT3264(local_720);
                    auVar206 = ZEXT3264(CONCAT428(fStack_724,
                                                  CONCAT424(fStack_728,
                                                            CONCAT420(fStack_72c,
                                                                      CONCAT416(fStack_730,
                                                                                CONCAT412(fStack_734
                                                                                          ,CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
                    ray = local_790;
                    uVar218 = local_7c0._0_4_;
                    uVar229 = local_7c0._4_4_;
                    uVar231 = local_7c0._8_4_;
                    uVar233 = local_7c0._12_4_;
                  }
                  auVar115 = local_7c0;
                  auVar122 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                  auVar193 = vpcmpeqd_avx2(auVar165,auVar165);
                  auVar114 = auVar193 & ~auVar122;
                  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar114 >> 0x7f,0) == '\0') &&
                        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar114 >> 0xbf,0) == '\0') &&
                      (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar114[0x1f]) {
                    auVar122 = auVar122 ^ auVar193;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      local_7c0._4_4_ = uVar229;
                      local_7c0._0_4_ = uVar218;
                      local_7c0._8_4_ = uVar231;
                      local_7c0._16_16_ = auVar115._16_16_;
                      local_7c0._12_4_ = uVar233;
                      auVar193 = ZEXT1632(auVar193._0_16_);
                      (*p_Var13)(&local_810);
                      auVar226 = ZEXT3264(_local_780);
                      auVar222 = ZEXT3264(local_700);
                      auVar217 = ZEXT3264(local_720);
                      auVar206 = ZEXT3264(CONCAT428(fStack_724,
                                                    CONCAT424(fStack_728,
                                                              CONCAT420(fStack_72c,
                                                                        CONCAT416(fStack_730,
                                                                                  CONCAT412(
                                                  fStack_734,
                                                  CONCAT48(fStack_738,CONCAT44(fStack_73c,local_740)
                                                          )))))));
                      ray = local_790;
                      uVar218 = local_7c0._0_4_;
                      uVar229 = local_7c0._4_4_;
                      uVar231 = local_7c0._8_4_;
                      uVar233 = local_7c0._12_4_;
                    }
                    auVar115 = vpcmpeqd_avx2(local_680[0],SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                                            );
                    auVar193 = vpcmpeqd_avx2(auVar193,auVar193);
                    auVar122 = auVar115 ^ auVar193;
                    auVar114 = auVar193 & ~auVar115;
                    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0x7f,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0xbf,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar114[0x1f] < '\0') {
                      auVar149._0_4_ = auVar115._0_4_ ^ auVar193._0_4_;
                      auVar149._4_4_ = auVar115._4_4_ ^ auVar193._4_4_;
                      auVar149._8_4_ = auVar115._8_4_ ^ auVar193._8_4_;
                      auVar149._12_4_ = auVar115._12_4_ ^ auVar193._12_4_;
                      auVar149._16_4_ = auVar115._16_4_ ^ auVar193._16_4_;
                      auVar149._20_4_ = auVar115._20_4_ ^ auVar193._20_4_;
                      auVar149._24_4_ = auVar115._24_4_ ^ auVar193._24_4_;
                      auVar149._28_4_ = auVar115._28_4_ ^ auVar193._28_4_;
                      auVar114 = vmaskmovps_avx(auVar149,*(undefined1 (*) [32])local_810.hit);
                      *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar114;
                      auVar114 = vmaskmovps_avx(auVar149,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x20));
                      *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar114;
                      auVar114 = vmaskmovps_avx(auVar149,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x40));
                      *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar114;
                      auVar114 = vmaskmovps_avx(auVar149,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x60));
                      *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar114;
                      auVar114 = vmaskmovps_avx(auVar149,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x80));
                      *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar114;
                      auVar114 = vpmaskmovd_avx2(auVar149,*(undefined1 (*) [32])
                                                           (local_810.hit + 0xa0));
                      *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar114;
                      auVar114 = vpmaskmovd_avx2(auVar149,*(undefined1 (*) [32])
                                                           (local_810.hit + 0xc0));
                      *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar114;
                      auVar114 = vpmaskmovd_avx2(auVar149,*(undefined1 (*) [32])
                                                           (local_810.hit + 0xe0));
                      *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar114;
                      auVar114 = vpmaskmovd_avx2(auVar149,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x100));
                      *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar114;
                    }
                  }
                  auVar114 = local_600;
                  auVar221 = auVar222._0_32_;
                  auVar173 = auVar217._0_32_;
                  if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar122 >> 0x7f,0) == '\0') &&
                        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar122 >> 0xbf,0) == '\0') &&
                      (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar122[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar218;
                  }
                  else {
                    uVar218 = *(undefined4 *)(ray + k * 4 + 0x100);
                    uVar229 = 0;
                    uVar231 = 0;
                    uVar233 = 0;
                  }
                  *(undefined4 *)(local_6a0 + uVar100 * 4) = 0;
                  auVar124._4_4_ = uVar218;
                  auVar124._0_4_ = uVar218;
                  auVar124._8_4_ = uVar218;
                  auVar124._12_4_ = uVar218;
                  auVar124._16_4_ = uVar218;
                  auVar124._20_4_ = uVar218;
                  auVar124._24_4_ = uVar218;
                  auVar124._28_4_ = uVar218;
                  auVar193 = vcmpps_avx(auVar114,auVar124,2);
                  auVar122 = vandps_avx(auVar193,local_6a0);
                  local_6a0 = local_6a0 & auVar193;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar150._8_4_ = 0x7f800000;
                  auVar150._0_8_ = 0x7f8000007f800000;
                  auVar150._12_4_ = 0x7f800000;
                  auVar150._16_4_ = 0x7f800000;
                  auVar150._20_4_ = 0x7f800000;
                  auVar150._24_4_ = 0x7f800000;
                  auVar150._28_4_ = 0x7f800000;
                  auVar114 = vblendvps_avx(auVar150,auVar114,auVar122);
                  auVar193 = vshufps_avx(auVar114,auVar114,0xb1);
                  auVar193 = vminps_avx(auVar114,auVar193);
                  auVar115 = vshufpd_avx(auVar193,auVar193,5);
                  auVar193 = vminps_avx(auVar193,auVar115);
                  auVar115 = vpermpd_avx2(auVar193,0x4e);
                  auVar193 = vminps_avx(auVar193,auVar115);
                  auVar193 = vcmpps_avx(auVar114,auVar193,0);
                  auVar115 = auVar122 & auVar193;
                  auVar114 = auVar122;
                  if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar115 >> 0x7f,0) != '\0') ||
                        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0xbf,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar115[0x1f] < '\0') {
                    auVar114 = vandps_avx(auVar193,auVar122);
                  }
                  uVar99 = vmovmskps_avx(auVar114);
                  uVar23 = 0;
                  for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                    uVar23 = uVar23 + 1;
                  }
                  uVar100 = (ulong)uVar23;
                  local_6a0 = auVar122;
                }
              }
            }
            goto LAB_0161d1af;
          }
        }
        auVar206 = ZEXT3264(auVar208);
      }
LAB_0161d1af:
      if (8 < iVar98) {
        _local_780 = auVar226._0_32_;
        local_4c0._4_4_ = iVar98;
        local_4c0._0_4_ = iVar98;
        local_4c0._8_4_ = iVar98;
        local_4c0._12_4_ = iVar98;
        local_4c0._16_4_ = iVar98;
        local_4c0._20_4_ = iVar98;
        local_4c0._24_4_ = iVar98;
        local_4c0._28_4_ = iVar98;
        local_120 = fVar152;
        fStack_11c = fVar152;
        fStack_118 = fVar152;
        fStack_114 = fVar152;
        fStack_110 = fVar152;
        fStack_10c = fVar152;
        fStack_108 = fVar152;
        fStack_104 = fVar152;
        local_140 = uVar104;
        uStack_13c = uVar104;
        uStack_138 = uVar104;
        uStack_134 = uVar104;
        uStack_130 = uVar104;
        uStack_12c = uVar104;
        uStack_128 = uVar104;
        uStack_124 = uVar104;
        local_1a0 = 1.0 / (float)local_5e0._0_4_;
        fStack_19c = local_1a0;
        fStack_198 = local_1a0;
        fStack_194 = local_1a0;
        fStack_190 = local_1a0;
        fStack_18c = local_1a0;
        fStack_188 = local_1a0;
        fStack_184 = local_1a0;
        local_160 = uVar97;
        uStack_15c = uVar97;
        uStack_158 = uVar97;
        uStack_154 = uVar97;
        uStack_150 = uVar97;
        uStack_14c = uVar97;
        uStack_148 = uVar97;
        uStack_144 = uVar97;
        local_180 = uVar11;
        uStack_17c = uVar11;
        uStack_178 = uVar11;
        uStack_174 = uVar11;
        uStack_170 = uVar11;
        uStack_16c = uVar11;
        uStack_168 = uVar11;
        uStack_164 = uVar11;
        lVar103 = 8;
        local_720 = auVar173;
        local_700 = auVar221;
        do {
          auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar103 * 4 + lVar24);
          auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b37f0 + lVar103 * 4);
          local_7c0 = *(undefined1 (*) [32])(lVar24 + 0x21b3c74 + lVar103 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar24 + 0x21b40f8 + lVar103 * 4);
          auVar96 = *(undefined1 (*) [28])*pauVar5;
          auVar217._0_4_ = local_540 * *(float *)*pauVar5;
          auVar217._4_4_ = fStack_53c * *(float *)(*pauVar5 + 4);
          auVar217._8_4_ = fStack_538 * *(float *)(*pauVar5 + 8);
          auVar217._12_4_ = fStack_534 * *(float *)(*pauVar5 + 0xc);
          auVar217._16_4_ = fStack_530 * *(float *)(*pauVar5 + 0x10);
          auVar217._20_4_ = fStack_52c * *(float *)(*pauVar5 + 0x14);
          auVar217._28_36_ = auVar226._28_36_;
          auVar217._24_4_ = fStack_528 * *(float *)(*pauVar5 + 0x18);
          auVar42._4_4_ = auVar206._4_4_ * *(float *)(*pauVar5 + 4);
          auVar42._0_4_ = auVar206._0_4_ * *(float *)*pauVar5;
          auVar42._8_4_ = auVar206._8_4_ * *(float *)(*pauVar5 + 8);
          auVar42._12_4_ = auVar206._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar42._16_4_ = auVar206._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar42._20_4_ = auVar206._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar42._24_4_ = auVar206._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar42._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
          auVar15 = vfmadd231ps_fma(auVar217._0_32_,local_7c0,local_760);
          auVar16 = vfmadd231ps_fma(auVar42,local_7c0,local_6c0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,auVar242);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar122,local_580);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar114,auVar239);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar114,local_560);
          auVar193 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar103 * 4 + lVar24);
          auVar115 = *(undefined1 (*) [32])(lVar24 + 0x21b5c10 + lVar103 * 4);
          auVar142 = *(undefined1 (*) [32])(lVar24 + 0x21b6094 + lVar103 * 4);
          pfVar6 = (float *)(lVar24 + 0x21b6518 + lVar103 * 4);
          fVar130 = *pfVar6;
          fVar77 = pfVar6[1];
          fVar78 = pfVar6[2];
          fVar79 = pfVar6[3];
          fVar80 = pfVar6[4];
          fVar81 = pfVar6[5];
          fVar82 = pfVar6[6];
          auVar43._4_4_ = fVar77 * fStack_53c;
          auVar43._0_4_ = fVar130 * local_540;
          auVar43._8_4_ = fVar78 * fStack_538;
          auVar43._12_4_ = fVar79 * fStack_534;
          auVar43._16_4_ = fVar80 * fStack_530;
          auVar43._20_4_ = fVar81 * fStack_52c;
          auVar43._24_4_ = fVar82 * fStack_528;
          auVar43._28_4_ = local_7c0._28_4_;
          auVar44._4_4_ = fVar77 * auVar206._4_4_;
          auVar44._0_4_ = fVar130 * auVar206._0_4_;
          auVar44._8_4_ = fVar78 * auVar206._8_4_;
          auVar44._12_4_ = fVar79 * auVar206._12_4_;
          auVar44._16_4_ = fVar80 * auVar206._16_4_;
          auVar44._20_4_ = fVar81 * auVar206._20_4_;
          auVar44._24_4_ = fVar82 * auVar206._24_4_;
          auVar44._28_4_ = fStack_524;
          auVar111 = vfmadd231ps_fma(auVar43,auVar142,local_760);
          auVar133 = vfmadd231ps_fma(auVar44,auVar142,local_6c0);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar115,auVar242);
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar115,local_580);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar193,auVar239);
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar193,local_560);
          local_5a0 = ZEXT1632(auVar111);
          _local_5c0 = ZEXT1632(auVar15);
          auVar189 = vsubps_avx(local_5a0,_local_5c0);
          local_6e0 = ZEXT1632(auVar133);
          local_480 = ZEXT1632(auVar16);
          local_4a0 = vsubps_avx(local_6e0,local_480);
          auVar76._4_4_ = auVar189._4_4_ * auVar16._4_4_;
          auVar76._0_4_ = auVar189._0_4_ * auVar16._0_4_;
          auVar76._8_4_ = auVar189._8_4_ * auVar16._8_4_;
          auVar76._12_4_ = auVar189._12_4_ * auVar16._12_4_;
          auVar76._16_4_ = auVar189._16_4_ * 0.0;
          auVar76._20_4_ = auVar189._20_4_ * 0.0;
          auVar76._24_4_ = auVar189._24_4_ * 0.0;
          auVar76._28_4_ = local_580._28_4_;
          fVar152 = local_4a0._0_4_;
          fVar151 = local_4a0._4_4_;
          auVar75._4_4_ = auVar15._4_4_ * fVar151;
          auVar75._0_4_ = auVar15._0_4_ * fVar152;
          fVar125 = local_4a0._8_4_;
          auVar75._8_4_ = auVar15._8_4_ * fVar125;
          fVar126 = local_4a0._12_4_;
          auVar75._12_4_ = auVar15._12_4_ * fVar126;
          fVar127 = local_4a0._16_4_;
          auVar75._16_4_ = fVar127 * 0.0;
          fVar128 = local_4a0._20_4_;
          auVar75._20_4_ = fVar128 * 0.0;
          fVar129 = local_4a0._24_4_;
          auVar75._24_4_ = fVar129 * 0.0;
          auVar75._28_4_ = local_760._28_4_;
          auVar226 = ZEXT3264(*pauVar5);
          auVar17 = vsubps_avx(auVar76,auVar75);
          auVar45._4_4_ = auVar96._4_4_ * local_e0._4_4_;
          auVar45._0_4_ = auVar96._0_4_ * (float)local_e0;
          auVar45._8_4_ = auVar96._8_4_ * (float)uStack_d8;
          auVar45._12_4_ = auVar96._12_4_ * uStack_d8._4_4_;
          auVar45._16_4_ = auVar96._16_4_ * (float)uStack_d0;
          auVar45._20_4_ = auVar96._20_4_ * uStack_d0._4_4_;
          auVar45._24_4_ = auVar96._24_4_ * (float)uStack_c8;
          auVar45._28_4_ = local_580._28_4_;
          auVar15 = vfmadd231ps_fma(auVar45,local_7c0,local_c0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,local_a0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_80,auVar114);
          auVar46._4_4_ = fVar77 * local_e0._4_4_;
          auVar46._0_4_ = fVar130 * (float)local_e0;
          auVar46._8_4_ = fVar78 * (float)uStack_d8;
          auVar46._12_4_ = fVar79 * uStack_d8._4_4_;
          auVar46._16_4_ = fVar80 * (float)uStack_d0;
          auVar46._20_4_ = fVar81 * uStack_d0._4_4_;
          auVar46._24_4_ = fVar82 * (float)uStack_c8;
          auVar46._28_4_ = uStack_c8._4_4_;
          auVar16 = vfmadd231ps_fma(auVar46,auVar142,local_c0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar115,local_a0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar193,local_80);
          auVar47._4_4_ = fVar151 * fVar151;
          auVar47._0_4_ = fVar152 * fVar152;
          auVar47._8_4_ = fVar125 * fVar125;
          auVar47._12_4_ = fVar126 * fVar126;
          auVar47._16_4_ = fVar127 * fVar127;
          auVar47._20_4_ = fVar128 * fVar128;
          auVar47._24_4_ = fVar129 * fVar129;
          auVar47._28_4_ = local_4a0._28_4_;
          auVar111 = vfmadd231ps_fma(auVar47,auVar189,auVar189);
          auVar117 = ZEXT1632(auVar15);
          auVar9 = vmaxps_avx(auVar117,ZEXT1632(auVar16));
          auVar209._0_4_ = auVar9._0_4_ * auVar9._0_4_ * auVar111._0_4_;
          auVar209._4_4_ = auVar9._4_4_ * auVar9._4_4_ * auVar111._4_4_;
          auVar209._8_4_ = auVar9._8_4_ * auVar9._8_4_ * auVar111._8_4_;
          auVar209._12_4_ = auVar9._12_4_ * auVar9._12_4_ * auVar111._12_4_;
          auVar209._16_4_ = auVar9._16_4_ * auVar9._16_4_ * 0.0;
          auVar209._20_4_ = auVar9._20_4_ * auVar9._20_4_ * 0.0;
          auVar209._24_4_ = auVar9._24_4_ * auVar9._24_4_ * 0.0;
          auVar209._28_4_ = 0;
          auVar48._4_4_ = auVar17._4_4_ * auVar17._4_4_;
          auVar48._0_4_ = auVar17._0_4_ * auVar17._0_4_;
          auVar48._8_4_ = auVar17._8_4_ * auVar17._8_4_;
          auVar48._12_4_ = auVar17._12_4_ * auVar17._12_4_;
          auVar48._16_4_ = auVar17._16_4_ * auVar17._16_4_;
          auVar48._20_4_ = auVar17._20_4_ * auVar17._20_4_;
          auVar48._24_4_ = auVar17._24_4_ * auVar17._24_4_;
          auVar48._28_4_ = auVar17._28_4_;
          auVar9 = vcmpps_avx(auVar48,auVar209,2);
          local_3e0 = (int)lVar103;
          auVar210._4_4_ = local_3e0;
          auVar210._0_4_ = local_3e0;
          auVar210._8_4_ = local_3e0;
          auVar210._12_4_ = local_3e0;
          auVar210._16_4_ = local_3e0;
          auVar210._20_4_ = local_3e0;
          auVar210._24_4_ = local_3e0;
          auVar210._28_4_ = local_3e0;
          auVar17 = vpor_avx2(auVar210,_DAT_01fe9900);
          auVar165 = vpcmpgtd_avx2(local_4c0,auVar17);
          auVar17 = auVar165 & auVar9;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0x7f,0) == '\0') &&
                (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar17 >> 0xbf,0) == '\0') &&
              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar17[0x1f]) {
            auVar206 = ZEXT3264(CONCAT428(fStack_724,
                                          CONCAT424(fStack_728,
                                                    CONCAT420(fStack_72c,
                                                              CONCAT416(fStack_730,
                                                                        CONCAT412(fStack_734,
                                                                                  CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
          }
          else {
            local_4e0 = vandps_avx(auVar165,auVar9);
            auVar49._4_4_ = fVar77 * (float)local_780._4_4_;
            auVar49._0_4_ = fVar130 * (float)local_780._0_4_;
            auVar49._8_4_ = fVar78 * fStack_778;
            auVar49._12_4_ = fVar79 * fStack_774;
            auVar49._16_4_ = fVar80 * fStack_770;
            auVar49._20_4_ = fVar81 * fStack_76c;
            auVar49._24_4_ = fVar82 * fStack_768;
            auVar49._28_4_ = auVar9._28_4_;
            auVar15 = vfmadd213ps_fma(auVar142,local_700,auVar49);
            auVar15 = vfmadd213ps_fma(auVar115,local_720,ZEXT1632(auVar15));
            auVar15 = vfmadd213ps_fma(auVar193,local_640,ZEXT1632(auVar15));
            auVar50._4_4_ = auVar96._4_4_ * (float)local_780._4_4_;
            auVar50._0_4_ = auVar96._0_4_ * (float)local_780._0_4_;
            auVar50._8_4_ = auVar96._8_4_ * fStack_778;
            auVar50._12_4_ = auVar96._12_4_ * fStack_774;
            auVar50._16_4_ = auVar96._16_4_ * fStack_770;
            auVar50._20_4_ = auVar96._20_4_ * fStack_76c;
            auVar50._24_4_ = auVar96._24_4_ * fStack_768;
            auVar50._28_4_ = auVar9._28_4_;
            auVar111 = vfmadd213ps_fma(local_7c0,local_700,auVar50);
            auVar111 = vfmadd213ps_fma(auVar122,local_720,ZEXT1632(auVar111));
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b457c + lVar103 * 4);
            auVar193 = *(undefined1 (*) [32])(lVar24 + 0x21b4a00 + lVar103 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar24 + 0x21b4e84 + lVar103 * 4);
            pfVar6 = (float *)(lVar24 + 0x21b5308 + lVar103 * 4);
            fVar152 = *pfVar6;
            fVar151 = pfVar6[1];
            fVar125 = pfVar6[2];
            fVar126 = pfVar6[3];
            fVar127 = pfVar6[4];
            fVar128 = pfVar6[5];
            fVar129 = pfVar6[6];
            auVar51._4_4_ = fStack_53c * fVar151;
            auVar51._0_4_ = local_540 * fVar152;
            auVar51._8_4_ = fStack_538 * fVar125;
            auVar51._12_4_ = fStack_534 * fVar126;
            auVar51._16_4_ = fStack_530 * fVar127;
            auVar51._20_4_ = fStack_52c * fVar128;
            auVar51._24_4_ = fStack_528 * fVar129;
            auVar51._28_4_ = local_700._28_4_;
            auVar52._4_4_ = fStack_73c * fVar151;
            auVar52._0_4_ = local_740 * fVar152;
            auVar52._8_4_ = fStack_738 * fVar125;
            auVar52._12_4_ = fStack_734 * fVar126;
            auVar52._16_4_ = fStack_730 * fVar127;
            auVar52._20_4_ = fStack_72c * fVar128;
            auVar52._24_4_ = fStack_728 * fVar129;
            auVar52._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
            auVar53._4_4_ = fVar151 * (float)local_780._4_4_;
            auVar53._0_4_ = fVar152 * (float)local_780._0_4_;
            auVar53._8_4_ = fVar125 * fStack_778;
            auVar53._12_4_ = fVar126 * fStack_774;
            auVar53._16_4_ = fVar127 * fStack_770;
            auVar53._20_4_ = fVar128 * fStack_76c;
            auVar53._24_4_ = fVar129 * fStack_768;
            auVar53._28_4_ = pfVar6[7];
            auVar133 = vfmadd231ps_fma(auVar51,auVar115,local_760);
            auVar107 = vfmadd231ps_fma(auVar52,auVar115,local_6c0);
            auVar134 = vfmadd231ps_fma(auVar53,local_700,auVar115);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar193,auVar242);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar193,local_580);
            auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),local_720,auVar193);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar122,auVar239);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,local_560);
            auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),local_640,auVar122);
            pfVar6 = (float *)(lVar24 + 0x21b7728 + lVar103 * 4);
            fVar152 = *pfVar6;
            fVar151 = pfVar6[1];
            fVar125 = pfVar6[2];
            fVar126 = pfVar6[3];
            fVar127 = pfVar6[4];
            fVar128 = pfVar6[5];
            fVar129 = pfVar6[6];
            auVar54._4_4_ = fStack_53c * fVar151;
            auVar54._0_4_ = local_540 * fVar152;
            auVar54._8_4_ = fStack_538 * fVar125;
            auVar54._12_4_ = fStack_534 * fVar126;
            auVar54._16_4_ = fStack_530 * fVar127;
            auVar54._20_4_ = fStack_52c * fVar128;
            auVar54._24_4_ = fStack_528 * fVar129;
            auVar54._28_4_ = fStack_524;
            auVar55._4_4_ = fStack_73c * fVar151;
            auVar55._0_4_ = local_740 * fVar152;
            auVar55._8_4_ = fStack_738 * fVar125;
            auVar55._12_4_ = fStack_734 * fVar126;
            auVar55._16_4_ = fStack_730 * fVar127;
            auVar55._20_4_ = fStack_72c * fVar128;
            auVar55._24_4_ = fStack_728 * fVar129;
            auVar55._28_4_ = local_640._28_4_;
            auVar56._4_4_ = (float)local_780._4_4_ * fVar151;
            auVar56._0_4_ = (float)local_780._0_4_ * fVar152;
            auVar56._8_4_ = fStack_778 * fVar125;
            auVar56._12_4_ = fStack_774 * fVar126;
            auVar56._16_4_ = fStack_770 * fVar127;
            auVar56._20_4_ = fStack_76c * fVar128;
            auVar56._24_4_ = fStack_768 * fVar129;
            auVar56._28_4_ = pfVar6[7];
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b72a4 + lVar103 * 4);
            auVar168 = vfmadd231ps_fma(auVar54,auVar122,local_760);
            auVar177 = vfmadd231ps_fma(auVar55,auVar122,local_6c0);
            auVar106 = vfmadd231ps_fma(auVar56,auVar122,local_700);
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b6e20 + lVar103 * 4);
            auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar122,auVar242);
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar122,local_580);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar122,local_720);
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b699c + lVar103 * 4);
            auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar122,auVar239);
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar122,local_560);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),local_640,auVar122);
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar211._16_4_ = 0x7fffffff;
            auVar211._20_4_ = 0x7fffffff;
            auVar211._24_4_ = 0x7fffffff;
            auVar211._28_4_ = 0x7fffffff;
            auVar122 = vandps_avx(ZEXT1632(auVar133),auVar211);
            auVar193 = vandps_avx(ZEXT1632(auVar107),auVar211);
            auVar193 = vmaxps_avx(auVar122,auVar193);
            auVar122 = vandps_avx(ZEXT1632(auVar134),auVar211);
            auVar122 = vmaxps_avx(auVar193,auVar122);
            auVar95._4_4_ = fStack_11c;
            auVar95._0_4_ = local_120;
            auVar95._8_4_ = fStack_118;
            auVar95._12_4_ = fStack_114;
            auVar95._16_4_ = fStack_110;
            auVar95._20_4_ = fStack_10c;
            auVar95._24_4_ = fStack_108;
            auVar95._28_4_ = fStack_104;
            auVar122 = vcmpps_avx(auVar122,auVar95,1);
            auVar115 = vblendvps_avx(ZEXT1632(auVar133),auVar189,auVar122);
            auVar142 = vblendvps_avx(ZEXT1632(auVar107),local_4a0,auVar122);
            auVar122 = vandps_avx(ZEXT1632(auVar168),auVar211);
            auVar193 = vandps_avx(ZEXT1632(auVar177),auVar211);
            auVar193 = vmaxps_avx(auVar122,auVar193);
            auVar122 = vandps_avx(auVar211,ZEXT1632(auVar106));
            auVar122 = vmaxps_avx(auVar193,auVar122);
            auVar193 = vcmpps_avx(auVar122,auVar95,1);
            auVar122 = vblendvps_avx(ZEXT1632(auVar168),auVar189,auVar193);
            auVar193 = vblendvps_avx(ZEXT1632(auVar177),local_4a0,auVar193);
            auVar111 = vfmadd213ps_fma(auVar114,local_640,ZEXT1632(auVar111));
            auVar133 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar142,auVar142);
            auVar114 = vrsqrtps_avx(ZEXT1632(auVar133));
            fVar152 = auVar114._0_4_;
            fVar151 = auVar114._4_4_;
            fVar125 = auVar114._8_4_;
            fVar126 = auVar114._12_4_;
            fVar127 = auVar114._16_4_;
            fVar128 = auVar114._20_4_;
            fVar129 = auVar114._24_4_;
            auVar57._4_4_ = fVar151 * fVar151 * fVar151 * auVar133._4_4_ * -0.5;
            auVar57._0_4_ = fVar152 * fVar152 * fVar152 * auVar133._0_4_ * -0.5;
            auVar57._8_4_ = fVar125 * fVar125 * fVar125 * auVar133._8_4_ * -0.5;
            auVar57._12_4_ = fVar126 * fVar126 * fVar126 * auVar133._12_4_ * -0.5;
            auVar57._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar57._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar57._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar57._28_4_ = 0;
            auVar241._8_4_ = 0x3fc00000;
            auVar241._0_8_ = 0x3fc000003fc00000;
            auVar241._12_4_ = 0x3fc00000;
            auVar241._16_4_ = 0x3fc00000;
            auVar241._20_4_ = 0x3fc00000;
            auVar241._24_4_ = 0x3fc00000;
            auVar241._28_4_ = 0x3fc00000;
            auVar133 = vfmadd231ps_fma(auVar57,auVar241,auVar114);
            fVar152 = auVar133._0_4_;
            fVar151 = auVar133._4_4_;
            auVar58._4_4_ = auVar142._4_4_ * fVar151;
            auVar58._0_4_ = auVar142._0_4_ * fVar152;
            fVar125 = auVar133._8_4_;
            auVar58._8_4_ = auVar142._8_4_ * fVar125;
            fVar126 = auVar133._12_4_;
            auVar58._12_4_ = auVar142._12_4_ * fVar126;
            auVar58._16_4_ = auVar142._16_4_ * 0.0;
            auVar58._20_4_ = auVar142._20_4_ * 0.0;
            auVar58._24_4_ = auVar142._24_4_ * 0.0;
            auVar58._28_4_ = auVar114._28_4_;
            auVar59._4_4_ = fVar151 * -auVar115._4_4_;
            auVar59._0_4_ = fVar152 * -auVar115._0_4_;
            auVar59._8_4_ = fVar125 * -auVar115._8_4_;
            auVar59._12_4_ = fVar126 * -auVar115._12_4_;
            auVar59._16_4_ = -auVar115._16_4_ * 0.0;
            auVar59._20_4_ = -auVar115._20_4_ * 0.0;
            auVar59._24_4_ = -auVar115._24_4_ * 0.0;
            auVar59._28_4_ = auVar142._28_4_;
            auVar133 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar193,auVar193);
            auVar114 = vrsqrtps_avx(ZEXT1632(auVar133));
            auVar60._28_4_ = uStack_764;
            auVar60._0_28_ =
                 ZEXT1628(CONCAT412(fVar126 * 0.0,
                                    CONCAT48(fVar125 * 0.0,CONCAT44(fVar151 * 0.0,fVar152 * 0.0))));
            fVar152 = auVar114._0_4_;
            fVar151 = auVar114._4_4_;
            fVar125 = auVar114._8_4_;
            fVar126 = auVar114._12_4_;
            fVar127 = auVar114._16_4_;
            fVar128 = auVar114._20_4_;
            fVar129 = auVar114._24_4_;
            auVar61._4_4_ = fVar151 * fVar151 * fVar151 * auVar133._4_4_ * -0.5;
            auVar61._0_4_ = fVar152 * fVar152 * fVar152 * auVar133._0_4_ * -0.5;
            auVar61._8_4_ = fVar125 * fVar125 * fVar125 * auVar133._8_4_ * -0.5;
            auVar61._12_4_ = fVar126 * fVar126 * fVar126 * auVar133._12_4_ * -0.5;
            auVar61._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar61._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar61._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar61._28_4_ = 0;
            auVar133 = vfmadd231ps_fma(auVar61,auVar241,auVar114);
            fVar152 = auVar133._0_4_;
            auVar228._0_4_ = auVar193._0_4_ * fVar152;
            fVar151 = auVar133._4_4_;
            auVar228._4_4_ = auVar193._4_4_ * fVar151;
            fVar125 = auVar133._8_4_;
            auVar228._8_4_ = auVar193._8_4_ * fVar125;
            fVar126 = auVar133._12_4_;
            auVar228._12_4_ = auVar193._12_4_ * fVar126;
            auVar228._16_4_ = auVar193._16_4_ * 0.0;
            auVar228._20_4_ = auVar193._20_4_ * 0.0;
            auVar228._24_4_ = auVar193._24_4_ * 0.0;
            auVar228._28_4_ = 0;
            auVar62._4_4_ = fVar151 * -auVar122._4_4_;
            auVar62._0_4_ = fVar152 * -auVar122._0_4_;
            auVar62._8_4_ = fVar125 * -auVar122._8_4_;
            auVar62._12_4_ = fVar126 * -auVar122._12_4_;
            auVar62._16_4_ = -auVar122._16_4_ * 0.0;
            auVar62._20_4_ = -auVar122._20_4_ * 0.0;
            auVar62._24_4_ = -auVar122._24_4_ * 0.0;
            auVar62._28_4_ = auVar114._28_4_;
            auVar63._28_4_ = 0xbf000000;
            auVar63._0_28_ =
                 ZEXT1628(CONCAT412(fVar126 * 0.0,
                                    CONCAT48(fVar125 * 0.0,CONCAT44(fVar151 * 0.0,fVar152 * 0.0))));
            auVar133 = vfmadd213ps_fma(auVar58,auVar117,_local_5c0);
            auVar107 = vfmadd213ps_fma(auVar59,auVar117,local_480);
            auVar134 = vfmadd213ps_fma(auVar60,auVar117,ZEXT1632(auVar111));
            auVar132 = vfnmadd213ps_fma(auVar58,auVar117,_local_5c0);
            auVar168 = vfmadd213ps_fma(auVar228,ZEXT1632(auVar16),local_5a0);
            auVar176 = vfnmadd213ps_fma(auVar59,auVar117,local_480);
            auVar114 = ZEXT1632(auVar16);
            auVar177 = vfmadd213ps_fma(auVar62,auVar114,local_6e0);
            auVar187 = vfnmadd231ps_fma(ZEXT1632(auVar111),auVar117,auVar60);
            auVar111 = vfmadd213ps_fma(auVar63,auVar114,ZEXT1632(auVar15));
            auVar185 = vfnmadd213ps_fma(auVar228,auVar114,local_5a0);
            auVar186 = vfnmadd213ps_fma(auVar62,auVar114,local_6e0);
            auVar15 = vfnmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar16),auVar63);
            local_7e0 = ZEXT1632(auVar15);
            auVar114 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar176));
            auVar122 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar187));
            auVar64._4_4_ = auVar114._4_4_ * auVar187._4_4_;
            auVar64._0_4_ = auVar114._0_4_ * auVar187._0_4_;
            auVar64._8_4_ = auVar114._8_4_ * auVar187._8_4_;
            auVar64._12_4_ = auVar114._12_4_ * auVar187._12_4_;
            auVar64._16_4_ = auVar114._16_4_ * 0.0;
            auVar64._20_4_ = auVar114._20_4_ * 0.0;
            auVar64._24_4_ = auVar114._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar176),auVar122);
            auVar65._4_4_ = auVar132._4_4_ * auVar122._4_4_;
            auVar65._0_4_ = auVar132._0_4_ * auVar122._0_4_;
            auVar65._8_4_ = auVar132._8_4_ * auVar122._8_4_;
            auVar65._12_4_ = auVar132._12_4_ * auVar122._12_4_;
            auVar65._16_4_ = auVar122._16_4_ * 0.0;
            auVar65._20_4_ = auVar122._20_4_ * 0.0;
            auVar65._24_4_ = auVar122._24_4_ * 0.0;
            auVar65._28_4_ = auVar122._28_4_;
            auVar189 = ZEXT1632(auVar132);
            auVar122 = vsubps_avx(ZEXT1632(auVar168),auVar189);
            auVar165 = ZEXT1632(auVar187);
            auVar15 = vfmsub231ps_fma(auVar65,auVar165,auVar122);
            auVar66._4_4_ = auVar176._4_4_ * auVar122._4_4_;
            auVar66._0_4_ = auVar176._0_4_ * auVar122._0_4_;
            auVar66._8_4_ = auVar176._8_4_ * auVar122._8_4_;
            auVar66._12_4_ = auVar176._12_4_ * auVar122._12_4_;
            auVar66._16_4_ = auVar122._16_4_ * 0.0;
            auVar66._20_4_ = auVar122._20_4_ * 0.0;
            auVar66._24_4_ = auVar122._24_4_ * 0.0;
            auVar66._28_4_ = auVar122._28_4_;
            auVar132 = vfmsub231ps_fma(auVar66,auVar189,auVar114);
            auVar114 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar114,ZEXT1632(auVar15));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar114,ZEXT1632(auVar106));
            auVar14 = vcmpps_avx(ZEXT1632(auVar15),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar114 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar133),auVar14);
            auVar122 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar107),auVar14);
            auVar193 = vblendvps_avx(local_7e0,ZEXT1632(auVar134),auVar14);
            auVar226 = ZEXT3264(auVar193);
            auVar115 = vblendvps_avx(auVar189,ZEXT1632(auVar168),auVar14);
            auVar142 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar177),auVar14);
            auVar9 = vblendvps_avx(auVar165,ZEXT1632(auVar111),auVar14);
            auVar189 = vblendvps_avx(ZEXT1632(auVar168),auVar189,auVar14);
            auVar17 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar176),auVar14);
            auVar15 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
            auVar165 = vblendvps_avx(ZEXT1632(auVar111),auVar165,auVar14);
            auVar189 = vsubps_avx(auVar189,auVar114);
            auVar17 = vsubps_avx(auVar17,auVar122);
            auVar21 = vsubps_avx(auVar165,auVar193);
            auVar22 = vsubps_avx(auVar114,auVar115);
            auVar116 = vsubps_avx(auVar122,auVar142);
            auVar118 = vsubps_avx(auVar193,auVar9);
            auVar190._0_4_ = auVar21._0_4_ * auVar114._0_4_;
            auVar190._4_4_ = auVar21._4_4_ * auVar114._4_4_;
            auVar190._8_4_ = auVar21._8_4_ * auVar114._8_4_;
            auVar190._12_4_ = auVar21._12_4_ * auVar114._12_4_;
            auVar190._16_4_ = auVar21._16_4_ * auVar114._16_4_;
            auVar190._20_4_ = auVar21._20_4_ * auVar114._20_4_;
            auVar190._24_4_ = auVar21._24_4_ * auVar114._24_4_;
            auVar190._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar190,auVar193,auVar189);
            auVar67._4_4_ = auVar189._4_4_ * auVar122._4_4_;
            auVar67._0_4_ = auVar189._0_4_ * auVar122._0_4_;
            auVar67._8_4_ = auVar189._8_4_ * auVar122._8_4_;
            auVar67._12_4_ = auVar189._12_4_ * auVar122._12_4_;
            auVar67._16_4_ = auVar189._16_4_ * auVar122._16_4_;
            auVar67._20_4_ = auVar189._20_4_ * auVar122._20_4_;
            auVar67._24_4_ = auVar189._24_4_ * auVar122._24_4_;
            auVar67._28_4_ = auVar165._28_4_;
            auVar133 = vfmsub231ps_fma(auVar67,auVar114,auVar17);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT832(0) << 0x20,ZEXT1632(auVar111));
            auVar191._0_4_ = auVar193._0_4_ * auVar17._0_4_;
            auVar191._4_4_ = auVar193._4_4_ * auVar17._4_4_;
            auVar191._8_4_ = auVar193._8_4_ * auVar17._8_4_;
            auVar191._12_4_ = auVar193._12_4_ * auVar17._12_4_;
            auVar191._16_4_ = auVar193._16_4_ * auVar17._16_4_;
            auVar191._20_4_ = auVar193._20_4_ * auVar17._20_4_;
            auVar191._24_4_ = auVar193._24_4_ * auVar17._24_4_;
            auVar191._28_4_ = 0;
            auVar133 = vfmsub231ps_fma(auVar191,auVar122,auVar21);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT832(0) << 0x20,ZEXT1632(auVar133));
            auVar192._0_4_ = auVar118._0_4_ * auVar115._0_4_;
            auVar192._4_4_ = auVar118._4_4_ * auVar115._4_4_;
            auVar192._8_4_ = auVar118._8_4_ * auVar115._8_4_;
            auVar192._12_4_ = auVar118._12_4_ * auVar115._12_4_;
            auVar192._16_4_ = auVar118._16_4_ * auVar115._16_4_;
            auVar192._20_4_ = auVar118._20_4_ * auVar115._20_4_;
            auVar192._24_4_ = auVar118._24_4_ * auVar115._24_4_;
            auVar192._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar192,auVar22,auVar9);
            auVar68._4_4_ = auVar116._4_4_ * auVar9._4_4_;
            auVar68._0_4_ = auVar116._0_4_ * auVar9._0_4_;
            auVar68._8_4_ = auVar116._8_4_ * auVar9._8_4_;
            auVar68._12_4_ = auVar116._12_4_ * auVar9._12_4_;
            auVar68._16_4_ = auVar116._16_4_ * auVar9._16_4_;
            auVar68._20_4_ = auVar116._20_4_ * auVar9._20_4_;
            auVar68._24_4_ = auVar116._24_4_ * auVar9._24_4_;
            auVar68._28_4_ = auVar9._28_4_;
            auVar107 = vfmsub231ps_fma(auVar68,auVar142,auVar118);
            auVar69._4_4_ = auVar22._4_4_ * auVar142._4_4_;
            auVar69._0_4_ = auVar22._0_4_ * auVar142._0_4_;
            auVar69._8_4_ = auVar22._8_4_ * auVar142._8_4_;
            auVar69._12_4_ = auVar22._12_4_ * auVar142._12_4_;
            auVar69._16_4_ = auVar22._16_4_ * auVar142._16_4_;
            auVar69._20_4_ = auVar22._20_4_ * auVar142._20_4_;
            auVar69._24_4_ = auVar22._24_4_ * auVar142._24_4_;
            auVar69._28_4_ = auVar142._28_4_;
            auVar134 = vfmsub231ps_fma(auVar69,auVar116,auVar115);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar134),ZEXT832(0) << 0x20,ZEXT1632(auVar111));
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar115 = vmaxps_avx(ZEXT1632(auVar133),ZEXT1632(auVar107));
            auVar115 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
            auVar111 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            auVar15 = vpand_avx(auVar111,auVar15);
            auVar115 = vpmovsxwd_avx2(auVar15);
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0x7f,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0xbf,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar115[0x1f]) {
LAB_0161e09c:
              auVar175._8_8_ = local_680[1]._8_8_;
              auVar175._0_8_ = local_680[1]._0_8_;
              auVar175._16_8_ = local_680[1]._16_8_;
              auVar175._24_8_ = local_680[1]._24_8_;
            }
            else {
              auVar70._4_4_ = auVar118._4_4_ * auVar17._4_4_;
              auVar70._0_4_ = auVar118._0_4_ * auVar17._0_4_;
              auVar70._8_4_ = auVar118._8_4_ * auVar17._8_4_;
              auVar70._12_4_ = auVar118._12_4_ * auVar17._12_4_;
              auVar70._16_4_ = auVar118._16_4_ * auVar17._16_4_;
              auVar70._20_4_ = auVar118._20_4_ * auVar17._20_4_;
              auVar70._24_4_ = auVar118._24_4_ * auVar17._24_4_;
              auVar70._28_4_ = auVar115._28_4_;
              auVar177 = vfmsub231ps_fma(auVar70,auVar116,auVar21);
              auVar198._0_4_ = auVar21._0_4_ * auVar22._0_4_;
              auVar198._4_4_ = auVar21._4_4_ * auVar22._4_4_;
              auVar198._8_4_ = auVar21._8_4_ * auVar22._8_4_;
              auVar198._12_4_ = auVar21._12_4_ * auVar22._12_4_;
              auVar198._16_4_ = auVar21._16_4_ * auVar22._16_4_;
              auVar198._20_4_ = auVar21._20_4_ * auVar22._20_4_;
              auVar198._24_4_ = auVar21._24_4_ * auVar22._24_4_;
              auVar198._28_4_ = 0;
              auVar168 = vfmsub231ps_fma(auVar198,auVar189,auVar118);
              auVar71._4_4_ = auVar189._4_4_ * auVar116._4_4_;
              auVar71._0_4_ = auVar189._0_4_ * auVar116._0_4_;
              auVar71._8_4_ = auVar189._8_4_ * auVar116._8_4_;
              auVar71._12_4_ = auVar189._12_4_ * auVar116._12_4_;
              auVar71._16_4_ = auVar189._16_4_ * auVar116._16_4_;
              auVar71._20_4_ = auVar189._20_4_ * auVar116._20_4_;
              auVar71._24_4_ = auVar189._24_4_ * auVar116._24_4_;
              auVar71._28_4_ = auVar116._28_4_;
              auVar106 = vfmsub231ps_fma(auVar71,auVar22,auVar17);
              auVar111 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar168),ZEXT1632(auVar106));
              auVar134 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT1632(auVar177),ZEXT832(0) << 0x20);
              auVar115 = vrcpps_avx(ZEXT1632(auVar134));
              auVar225._8_4_ = 0x3f800000;
              auVar225._0_8_ = 0x3f8000003f800000;
              auVar225._12_4_ = 0x3f800000;
              auVar225._16_4_ = 0x3f800000;
              auVar225._20_4_ = 0x3f800000;
              auVar225._24_4_ = 0x3f800000;
              auVar225._28_4_ = 0x3f800000;
              auVar226 = ZEXT3264(auVar225);
              auVar111 = vfnmadd213ps_fma(auVar115,ZEXT1632(auVar134),auVar225);
              auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar115,auVar115);
              auVar72._4_4_ = auVar106._4_4_ * auVar193._4_4_;
              auVar72._0_4_ = auVar106._0_4_ * auVar193._0_4_;
              auVar72._8_4_ = auVar106._8_4_ * auVar193._8_4_;
              auVar72._12_4_ = auVar106._12_4_ * auVar193._12_4_;
              auVar72._16_4_ = auVar193._16_4_ * 0.0;
              auVar72._20_4_ = auVar193._20_4_ * 0.0;
              auVar72._24_4_ = auVar193._24_4_ * 0.0;
              auVar72._28_4_ = auVar17._28_4_;
              auVar168 = vfmadd231ps_fma(auVar72,auVar122,ZEXT1632(auVar168));
              auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),ZEXT1632(auVar177),auVar114);
              fVar152 = auVar111._0_4_;
              fVar151 = auVar111._4_4_;
              fVar125 = auVar111._8_4_;
              fVar126 = auVar111._12_4_;
              auVar193 = ZEXT1632(CONCAT412(fVar126 * auVar168._12_4_,
                                            CONCAT48(fVar125 * auVar168._8_4_,
                                                     CONCAT44(fVar151 * auVar168._4_4_,
                                                              fVar152 * auVar168._0_4_))));
              uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar174._4_4_ = uVar104;
              auVar174._0_4_ = uVar104;
              auVar174._8_4_ = uVar104;
              auVar174._12_4_ = uVar104;
              auVar174._16_4_ = uVar104;
              auVar174._20_4_ = uVar104;
              auVar174._24_4_ = uVar104;
              auVar174._28_4_ = uVar104;
              auVar94._4_4_ = uStack_13c;
              auVar94._0_4_ = local_140;
              auVar94._8_4_ = uStack_138;
              auVar94._12_4_ = uStack_134;
              auVar94._16_4_ = uStack_130;
              auVar94._20_4_ = uStack_12c;
              auVar94._24_4_ = uStack_128;
              auVar94._28_4_ = uStack_124;
              auVar114 = vcmpps_avx(auVar94,auVar193,2);
              auVar122 = vcmpps_avx(auVar193,auVar174,2);
              auVar114 = vandps_avx(auVar122,auVar114);
              auVar111 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
              auVar15 = vpand_avx(auVar15,auVar111);
              auVar114 = vpmovsxwd_avx2(auVar15);
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar114 >> 0x7f,0) == '\0') &&
                    (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar114 >> 0xbf,0) == '\0') &&
                  (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar114[0x1f]) goto LAB_0161e09c;
              auVar114 = vcmpps_avx(ZEXT1632(auVar134),ZEXT832(0) << 0x20,4);
              auVar111 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
              auVar15 = vpand_avx(auVar15,auVar111);
              auVar114 = vpmovsxwd_avx2(auVar15);
              auVar175._8_8_ = local_680[1]._8_8_;
              auVar175._0_8_ = local_680[1]._0_8_;
              auVar175._16_8_ = local_680[1]._16_8_;
              auVar175._24_8_ = local_680[1]._24_8_;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar115 = ZEXT1632(CONCAT412(fVar126 * auVar133._12_4_,
                                              CONCAT48(fVar125 * auVar133._8_4_,
                                                       CONCAT44(fVar151 * auVar133._4_4_,
                                                                fVar152 * auVar133._0_4_))));
                auVar73._28_4_ = SUB84(local_680[1]._24_8_,4);
                auVar73._0_28_ =
                     ZEXT1628(CONCAT412(fVar126 * auVar107._12_4_,
                                        CONCAT48(fVar125 * auVar107._8_4_,
                                                 CONCAT44(fVar151 * auVar107._4_4_,
                                                          fVar152 * auVar107._0_4_))));
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar205,auVar115);
                local_100 = vblendvps_avx(auVar122,auVar115,auVar14);
                auVar122 = vsubps_avx(auVar205,auVar73);
                local_520 = vblendvps_avx(auVar122,auVar73,auVar14);
                auVar175 = auVar114;
                local_620 = auVar193;
              }
            }
            auVar206 = ZEXT3264(CONCAT428(fStack_724,
                                          CONCAT424(fStack_728,
                                                    CONCAT420(fStack_72c,
                                                              CONCAT416(fStack_730,
                                                                        CONCAT412(fStack_734,
                                                                                  CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
            local_5e0 = auVar117;
            if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar175 >> 0x7f,0) != '\0') ||
                  (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0xbf,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar175[0x1f] < '\0') {
              auVar114 = vsubps_avx(ZEXT1632(auVar16),auVar117);
              auVar15 = vfmadd213ps_fma(auVar114,local_100,auVar117);
              fVar152 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar74._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar152;
              auVar74._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar152;
              auVar74._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar152;
              auVar74._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar152;
              auVar74._16_4_ = fVar152 * 0.0;
              auVar74._20_4_ = fVar152 * 0.0;
              auVar74._24_4_ = fVar152 * 0.0;
              auVar74._28_4_ = fVar152;
              auVar114 = vcmpps_avx(local_620,auVar74,6);
              auVar122 = auVar175 & auVar114;
              if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar122 >> 0x7f,0) != '\0') ||
                    (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar122 >> 0xbf,0) != '\0') ||
                  (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar122[0x1f] < '\0') {
                auVar145._8_4_ = 0xbf800000;
                auVar145._0_8_ = 0xbf800000bf800000;
                auVar145._12_4_ = 0xbf800000;
                auVar145._16_4_ = 0xbf800000;
                auVar145._20_4_ = 0xbf800000;
                auVar145._24_4_ = 0xbf800000;
                auVar145._28_4_ = 0xbf800000;
                auVar166._8_4_ = 0x40000000;
                auVar166._0_8_ = 0x4000000040000000;
                auVar166._12_4_ = 0x40000000;
                auVar166._16_4_ = 0x40000000;
                auVar166._20_4_ = 0x40000000;
                auVar166._24_4_ = 0x40000000;
                auVar166._28_4_ = 0x40000000;
                auVar15 = vfmadd213ps_fma(local_520,auVar166,auVar145);
                local_440 = local_100;
                local_420 = ZEXT1632(auVar15);
                local_400 = local_620;
                pGVar12 = (context->scene->geometries).items[uVar97].ptr;
                local_520 = local_420;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar114,auVar175);
                  fVar152 = (float)local_3e0;
                  local_360[0] = (fVar152 + local_100._0_4_ + 0.0) * local_1a0;
                  local_360[1] = (fVar152 + local_100._4_4_ + 1.0) * fStack_19c;
                  local_360[2] = (fVar152 + local_100._8_4_ + 2.0) * fStack_198;
                  local_360[3] = (fVar152 + local_100._12_4_ + 3.0) * fStack_194;
                  fStack_350 = (fVar152 + local_100._16_4_ + 4.0) * fStack_190;
                  fStack_34c = (fVar152 + local_100._20_4_ + 5.0) * fStack_18c;
                  fStack_348 = (fVar152 + local_100._24_4_ + 6.0) * fStack_188;
                  fStack_344 = fVar152 + local_100._28_4_ + 7.0;
                  local_520._0_8_ = auVar15._0_8_;
                  local_520._8_8_ = auVar15._8_8_;
                  local_340 = local_520._0_8_;
                  uStack_338 = local_520._8_8_;
                  uStack_330 = 0;
                  uStack_328 = 0;
                  local_320 = local_620;
                  auVar146._8_4_ = 0x7f800000;
                  auVar146._0_8_ = 0x7f8000007f800000;
                  auVar146._12_4_ = 0x7f800000;
                  auVar146._16_4_ = 0x7f800000;
                  auVar146._20_4_ = 0x7f800000;
                  auVar146._24_4_ = 0x7f800000;
                  auVar146._28_4_ = 0x7f800000;
                  auVar114 = vblendvps_avx(auVar146,local_620,local_6a0);
                  auVar122 = vshufps_avx(auVar114,auVar114,0xb1);
                  auVar122 = vminps_avx(auVar114,auVar122);
                  auVar193 = vshufpd_avx(auVar122,auVar122,5);
                  auVar122 = vminps_avx(auVar122,auVar193);
                  auVar193 = vpermpd_avx2(auVar122,0x4e);
                  auVar122 = vminps_avx(auVar122,auVar193);
                  auVar122 = vcmpps_avx(auVar114,auVar122,0);
                  auVar193 = local_6a0 & auVar122;
                  auVar114 = local_6a0;
                  if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar193 >> 0x7f,0) != '\0') ||
                        (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar193 >> 0xbf,0) != '\0') ||
                      (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar193[0x1f] < '\0') {
                    auVar114 = vandps_avx(auVar122,local_6a0);
                  }
                  uVar99 = vmovmskps_avx(auVar114);
                  uVar23 = 0;
                  for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                    uVar23 = uVar23 + 1;
                  }
                  uVar100 = (ulong)uVar23;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar152 = local_360[uVar100];
                    fVar151 = 1.0 - fVar152;
                    auVar111 = ZEXT416((uint)fVar152);
                    auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                              ZEXT416(0xc0a00000));
                    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * 3.0)),
                                              ZEXT416((uint)(fVar152 + fVar152)),auVar15);
                    auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                              ZEXT416(0x40000000));
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                              ZEXT416((uint)(fVar151 + fVar151)),auVar15);
                    auVar133 = vfnmadd231ss_fma(ZEXT416((uint)(fVar152 * (fVar151 + fVar151))),
                                                ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                    auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),auVar111,
                                               ZEXT416((uint)(fVar151 * -2.0)));
                    fVar151 = auVar15._0_4_ * 0.5;
                    fVar125 = auVar111._0_4_ * 0.5;
                    auVar171._0_4_ = fVar125 * local_8e0;
                    auVar171._4_4_ = fVar125 * fStack_8dc;
                    auVar171._8_4_ = fVar125 * fStack_8d8;
                    auVar171._12_4_ = fVar125 * fStack_8d4;
                    auVar136._4_4_ = fVar151;
                    auVar136._0_4_ = fVar151;
                    auVar136._8_4_ = fVar151;
                    auVar136._12_4_ = fVar151;
                    auVar15 = vfmadd132ps_fma(auVar136,auVar171,auVar18);
                    fVar151 = auVar16._0_4_ * 0.5;
                    auVar172._4_4_ = fVar151;
                    auVar172._0_4_ = fVar151;
                    auVar172._8_4_ = fVar151;
                    auVar172._12_4_ = fVar151;
                    auVar15 = vfmadd132ps_fma(auVar172,auVar15,auVar19);
                    uVar104 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                    fVar151 = auVar133._0_4_ * 0.5;
                    auVar155._4_4_ = fVar151;
                    auVar155._0_4_ = fVar151;
                    auVar155._8_4_ = fVar151;
                    auVar155._12_4_ = fVar151;
                    auVar15 = vfmadd132ps_fma(auVar155,auVar15,auVar20);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar100 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar15._0_4_;
                    uVar218 = vextractps_avx(auVar15,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar218;
                    uVar218 = vextractps_avx(auVar15,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar218;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar152;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar104;
                    *(uint *)(ray + k * 4 + 0x220) = uVar11;
                    *(uint *)(ray + k * 4 + 0x240) = uVar97;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_798 = context;
                    local_3dc = iVar98;
                    local_3d0 = uVar84;
                    uStack_3c8 = uVar85;
                    local_3c0 = uVar86;
                    uStack_3b8 = uVar87;
                    local_3b0 = uVar88;
                    uStack_3a8 = uVar89;
                    local_3a0 = uVar90;
                    uStack_398 = uVar91;
                    while( true ) {
                      fVar152 = local_360[uVar100];
                      auVar112._4_4_ = fVar152;
                      auVar112._0_4_ = fVar152;
                      auVar112._8_4_ = fVar152;
                      auVar112._12_4_ = fVar152;
                      local_260._16_4_ = fVar152;
                      local_260._0_16_ = auVar112;
                      local_260._20_4_ = fVar152;
                      local_260._24_4_ = fVar152;
                      local_260._28_4_ = fVar152;
                      local_240 = *(undefined4 *)((long)&local_340 + uVar100 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_320 + uVar100 * 4);
                      fVar151 = 1.0 - fVar152;
                      auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar112,
                                                ZEXT416(0xc0a00000));
                      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * 3.0)),
                                                ZEXT416((uint)(fVar152 + fVar152)),auVar15);
                      auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar112,
                                                ZEXT416(0x40000000));
                      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                                ZEXT416((uint)(fVar151 + fVar151)),auVar15);
                      auVar133 = vfnmadd231ss_fma(ZEXT416((uint)(fVar152 * (fVar151 + fVar151))),
                                                  ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                      auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),auVar112,
                                                 ZEXT416((uint)(fVar151 * -2.0)));
                      fVar152 = auVar15._0_4_ * 0.5;
                      fVar151 = auVar111._0_4_ * 0.5;
                      auVar179._0_4_ = fVar151 * local_8e0;
                      auVar179._4_4_ = fVar151 * fStack_8dc;
                      auVar179._8_4_ = fVar151 * fStack_8d8;
                      auVar179._12_4_ = fVar151 * fStack_8d4;
                      auVar156._4_4_ = fVar152;
                      auVar156._0_4_ = fVar152;
                      auVar156._8_4_ = fVar152;
                      auVar156._12_4_ = fVar152;
                      auVar15 = vfmadd132ps_fma(auVar156,auVar179,auVar109);
                      fVar152 = auVar16._0_4_ * 0.5;
                      auVar180._4_4_ = fVar152;
                      auVar180._0_4_ = fVar152;
                      auVar180._8_4_ = fVar152;
                      auVar180._12_4_ = fVar152;
                      auVar15 = vfmadd132ps_fma(auVar180,auVar15,auVar108);
                      local_810.context = context->user;
                      fVar152 = auVar133._0_4_ * 0.5;
                      auVar157._4_4_ = fVar152;
                      auVar157._0_4_ = fVar152;
                      auVar157._8_4_ = fVar152;
                      auVar157._12_4_ = fVar152;
                      auVar16 = vfmadd132ps_fma(auVar157,auVar15,auVar153);
                      local_2c0 = auVar16._0_4_;
                      uStack_2bc = local_2c0;
                      uStack_2b8 = local_2c0;
                      uStack_2b4 = local_2c0;
                      uStack_2b0 = local_2c0;
                      uStack_2ac = local_2c0;
                      uStack_2a8 = local_2c0;
                      uStack_2a4 = local_2c0;
                      auVar15 = vmovshdup_avx(auVar16);
                      local_2a0 = auVar15._0_8_;
                      uStack_298 = local_2a0;
                      uStack_290 = local_2a0;
                      uStack_288 = local_2a0;
                      auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
                      auVar158._0_8_ = auVar15._0_8_;
                      auVar158._8_8_ = auVar158._0_8_;
                      auVar167._16_8_ = auVar158._0_8_;
                      auVar167._0_16_ = auVar158;
                      auVar167._24_8_ = auVar158._0_8_;
                      local_280 = auVar167;
                      uStack_23c = local_240;
                      uStack_238 = local_240;
                      uStack_234 = local_240;
                      uStack_230 = local_240;
                      uStack_22c = local_240;
                      uStack_228 = local_240;
                      uStack_224 = local_240;
                      local_220 = CONCAT44(uStack_17c,local_180);
                      uStack_218 = CONCAT44(uStack_174,uStack_178);
                      uStack_210 = CONCAT44(uStack_16c,uStack_170);
                      uStack_208 = CONCAT44(uStack_164,uStack_168);
                      local_200._4_4_ = uStack_15c;
                      local_200._0_4_ = local_160;
                      local_200._8_4_ = uStack_158;
                      local_200._12_4_ = uStack_154;
                      local_200._16_4_ = uStack_150;
                      local_200._20_4_ = uStack_14c;
                      local_200._24_4_ = uStack_148;
                      local_200._28_4_ = uStack_144;
                      auVar114 = vpcmpeqd_avx2(local_200,local_200);
                      local_788[1] = auVar114;
                      *local_788 = auVar114;
                      local_1e0 = (local_810.context)->instID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = (local_810.context)->instPrimID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_680[0] = local_300;
                      local_810.valid = (int *)local_680;
                      local_810.geometryUserPtr = pGVar12->userPtr;
                      local_810.hit = (RTCHitN *)&local_2c0;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar167 = ZEXT1632(auVar158);
                        auVar226 = ZEXT1664(auVar226._0_16_);
                        (*pGVar12->intersectionFilterN)(&local_810);
                        context = local_798;
                      }
                      auVar122 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                      auVar193 = vpcmpeqd_avx2(auVar167,auVar167);
                      auVar114 = auVar193 & ~auVar122;
                      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar114 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar114 >> 0x7f,0) == '\0') &&
                            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar114 >> 0xbf,0) == '\0') &&
                          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar114[0x1f]) {
                        auVar122 = auVar122 ^ auVar193;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar193 = ZEXT1632(auVar193._0_16_);
                          auVar226 = ZEXT1664(auVar226._0_16_);
                          (*p_Var13)(&local_810);
                          context = local_798;
                        }
                        auVar115 = vpcmpeqd_avx2(local_680[0],
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar193 = vpcmpeqd_avx2(auVar193,auVar193);
                        auVar122 = auVar115 ^ auVar193;
                        auVar114 = auVar193 & ~auVar115;
                        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar114 >> 0x7f,0) != '\0')
                              || (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar114 >> 0xbf,0) != '\0') ||
                            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar114[0x1f] < '\0') {
                          auVar147._0_4_ = auVar115._0_4_ ^ auVar193._0_4_;
                          auVar147._4_4_ = auVar115._4_4_ ^ auVar193._4_4_;
                          auVar147._8_4_ = auVar115._8_4_ ^ auVar193._8_4_;
                          auVar147._12_4_ = auVar115._12_4_ ^ auVar193._12_4_;
                          auVar147._16_4_ = auVar115._16_4_ ^ auVar193._16_4_;
                          auVar147._20_4_ = auVar115._20_4_ ^ auVar193._20_4_;
                          auVar147._24_4_ = auVar115._24_4_ ^ auVar193._24_4_;
                          auVar147._28_4_ = auVar115._28_4_ ^ auVar193._28_4_;
                          auVar114 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])local_810.hit);
                          *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar114;
                          auVar114 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x20));
                          *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar114;
                          auVar114 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x40));
                          *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar114;
                          auVar114 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x60));
                          *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar114;
                          auVar114 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x80));
                          *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar114;
                          auVar114 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])
                                                               (local_810.hit + 0xa0));
                          *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar114;
                          auVar114 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])
                                                               (local_810.hit + 0xc0));
                          *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar114;
                          auVar114 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])
                                                               (local_810.hit + 0xe0));
                          *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar114;
                          auVar114 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])
                                                               (local_810.hit + 0x100));
                          *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar114;
                        }
                      }
                      auVar114 = local_620;
                      if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar122 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar122 >> 0x7f,0) == '\0') &&
                            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar122 >> 0xbf,0) == '\0') &&
                          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar122[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar104;
                      }
                      else {
                        uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_6a0 + uVar100 * 4) = 0;
                      auVar123._4_4_ = uVar104;
                      auVar123._0_4_ = uVar104;
                      auVar123._8_4_ = uVar104;
                      auVar123._12_4_ = uVar104;
                      auVar123._16_4_ = uVar104;
                      auVar123._20_4_ = uVar104;
                      auVar123._24_4_ = uVar104;
                      auVar123._28_4_ = uVar104;
                      auVar193 = vcmpps_avx(auVar114,auVar123,2);
                      auVar122 = vandps_avx(auVar193,local_6a0);
                      local_6a0 = local_6a0 & auVar193;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar148._8_4_ = 0x7f800000;
                      auVar148._0_8_ = 0x7f8000007f800000;
                      auVar148._12_4_ = 0x7f800000;
                      auVar148._16_4_ = 0x7f800000;
                      auVar148._20_4_ = 0x7f800000;
                      auVar148._24_4_ = 0x7f800000;
                      auVar148._28_4_ = 0x7f800000;
                      auVar114 = vblendvps_avx(auVar148,auVar114,auVar122);
                      auVar193 = vshufps_avx(auVar114,auVar114,0xb1);
                      auVar193 = vminps_avx(auVar114,auVar193);
                      auVar115 = vshufpd_avx(auVar193,auVar193,5);
                      auVar193 = vminps_avx(auVar193,auVar115);
                      auVar115 = vpermpd_avx2(auVar193,0x4e);
                      auVar193 = vminps_avx(auVar193,auVar115);
                      auVar193 = vcmpps_avx(auVar114,auVar193,0);
                      auVar115 = auVar122 & auVar193;
                      auVar114 = auVar122;
                      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar115 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar115 >> 0x7f,0) != '\0') ||
                            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar115 >> 0xbf,0) != '\0') ||
                          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar115[0x1f] < '\0') {
                        auVar114 = vandps_avx(auVar193,auVar122);
                      }
                      uVar99 = vmovmskps_avx(auVar114);
                      uVar23 = 0;
                      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                        uVar23 = uVar23 + 1;
                      }
                      uVar100 = (ulong)uVar23;
                      local_6a0 = auVar122;
                    }
                    auVar206 = ZEXT3264(CONCAT428(fStack_724,
                                                  CONCAT424(fStack_728,
                                                            CONCAT420(fStack_72c,
                                                                      CONCAT416(fStack_730,
                                                                                CONCAT412(fStack_734
                                                                                          ,CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
                  }
                }
              }
            }
          }
          lVar103 = lVar103 + 8;
        } while ((int)lVar103 < iVar98);
      }
      uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar110._4_4_ = uVar104;
      auVar110._0_4_ = uVar104;
      auVar110._8_4_ = uVar104;
      auVar110._12_4_ = uVar104;
      auVar15 = vcmpps_avx(local_460,auVar110,2);
      uVar97 = vmovmskps_avx(auVar15);
      uVar97 = (uint)uVar102 & uVar97;
    } while (uVar97 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }